

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::SampleLd
          (VolPathIntegrator *this,Interaction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,SampledSpectrum *T_hat,SampledSpectrum *pathPDF)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  short sVar95;
  ushort uVar96;
  Point3f p;
  Vector3f wiRender;
  Tuple3<pbrt::Point3,_pbrt::Interval> TVar97;
  SampledSpectrum *pSVar98;
  SampledSpectrum *pSVar99;
  Interval IVar100;
  MediumHandle MVar101;
  uint64_t uVar102;
  undefined1 auVar103 [40];
  int i;
  BxDFFlags BVar104;
  int iVar105;
  uint uVar106;
  SurfaceInteraction *pSVar107;
  MediumInteraction *pMVar108;
  byte bVar109;
  Vector3f *pVVar110;
  long lVar111;
  int iVar112;
  ulong uVar113;
  DenselySampledSpectrum *this_00;
  float *pfVar114;
  int *piVar115;
  ulong uVar116;
  int *piVar117;
  Ray *pRVar118;
  float *pfVar119;
  Ray *pRVar120;
  DebugMLTSampler *this_01;
  uintptr_t iptr;
  undefined8 *puVar121;
  float *pfVar122;
  long in_FS_OFFSET;
  bool bVar123;
  char cVar124;
  undefined1 auVar126 [16];
  undefined1 auVar133 [16];
  int iVar125;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar136 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  Float u;
  float fVar148;
  float fVar149;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar150 [16];
  float fVar195;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar194;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 extraout_var [12];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar197 [56];
  undefined1 auVar179 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar180 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar181 [64];
  undefined1 extraout_var_07 [56];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var_00 [60];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined8 uVar196;
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar176 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar177 [32];
  undefined1 auVar193 [64];
  undefined8 uVar198;
  float fVar247;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar246;
  float fVar249;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar248 [56];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  float fVar250;
  undefined8 uVar251;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  Float t1;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  Float t0;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [64];
  float fVar308;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 in_ZMM12 [64];
  undefined1 in_XMM14 [16];
  Point3f PVar322;
  Vector3f woRender;
  SampledSpectrum SVar323;
  Vector3f wiRender_00;
  Float nextCrossingT [3];
  int voxel [3];
  RNG rng;
  SampledSpectrum lightPathPDF;
  int step [3];
  Float deltaT [3];
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum T_ray;
  SampledSpectrum uniPathPDF;
  int voxelLimit [3];
  Ray lightRay;
  optional<pbrt::ShapeIntersection> si;
  optional<pbrt::LightLiSample> ls;
  float local_5fc;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  float local_5e4 [3];
  undefined1 local_5d8 [8];
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  RNG *pRStack_5c0;
  undefined8 local_5b0;
  Point3f local_5a8;
  undefined1 local_598 [8];
  undefined8 uStack_590;
  int local_584 [3];
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 auStack_568 [16];
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined1 local_528 [16];
  RNG local_518;
  float local_508;
  float local_504;
  anon_struct_8_0_00000001_for___align local_500;
  float local_4f8;
  undefined1 local_4f4 [12];
  Float FStack_4e8;
  MediumHandle local_4e0;
  undefined1 local_4d8 [16];
  SampledSpectrum local_4c8;
  int aiStack_4b0 [3];
  float afStack_4a4 [3];
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined1 local_478 [16];
  SampledSpectrum local_468;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  SampledSpectrum local_428;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [16];
  Interval IStack_3e8;
  Tuple3<pbrt::Normal3,_float> TStack_3e0;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  VolPathIntegrator *local_3c8;
  SampledWavelengths *local_3c0;
  anon_class_32_4_3820c045 local_3b8;
  int aiStack_394 [3];
  undefined1 local_388 [16];
  undefined1 local_370 [28];
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  float local_338;
  MediumInterface *local_330;
  MediumHandle local_328;
  PhaseFunctionHandle local_320;
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  SampledSpectrum local_2d8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined8 local_278;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  Interval local_258;
  Interval IStack_250;
  float fStack_248;
  ulong uStack_244;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_238;
  anon_struct_8_0_00000001_for___align local_228;
  SampledSpectrum *local_220;
  undefined1 local_218 [4];
  float afStack_214 [3];
  Interval IStack_208;
  undefined1 auStack_200 [8];
  undefined1 auStack_1f8 [8];
  undefined8 uStack_1f0;
  undefined1 auStack_1e8 [16];
  undefined1 local_1d8 [64];
  undefined1 local_198 [64];
  undefined1 local_158 [64];
  ulong local_118;
  Float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float afStack_c4 [3];
  ulong local_b8;
  float local_b0;
  float local_ac;
  Interaction local_a8;
  char local_58;
  undefined1 local_48 [16];
  undefined1 auVar127 [16];
  undefined1 auVar137 [64];
  undefined1 auVar141 [64];
  undefined1 auVar145 [64];
  undefined1 auVar178 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 auVar232 [64];
  
  auVar178 = _local_218;
  auVar126 = in_ZMM12._0_16_;
  auVar130 = in_ZMM8._0_16_;
  auVar129 = in_ZMM3._0_16_;
  TStack_3e0.z = 0.0;
  fStack_3d4 = 0.0;
  fStack_3d0 = 0.0;
  fStack_3cc = 0.0;
  local_3f8 = ZEXT816(0);
  IStack_3e8.low = 0.0;
  IStack_3e8.high = 0.0;
  TStack_3e0.x = 0.0;
  TStack_3e0.y = 0.0;
  local_3c8 = this;
  local_220 = T_hat;
  if (bsdf == (BSDF *)0x0) {
    IStack_3e8 = (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 z;
    IStack_208 = IStack_3e8;
    local_3f8._0_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    local_3f8._4_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    local_3f8._8_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    local_3f8._12_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    _local_218 = local_3f8;
    _auStack_200 = ZEXT816(0) << 0x20;
    auStack_1e8 = auVar178._48_16_;
    uStack_1f0 = 0;
    TStack_3e0.x = 0.0;
    TStack_3e0.y = 0.0;
    TStack_3e0.z = 0.0;
    fStack_3d4 = 0.0;
    fStack_3d0 = 0.0;
    fStack_3cc = 0.0;
  }
  else {
    pSVar107 = Interaction::AsSurface(intr);
    auVar103 = _auStack_200;
    TVar97 = (pSVar107->super_Interaction).pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>;
    _local_218 = (undefined1  [24])TVar97;
    auVar178 = _local_218;
    TStack_3e0.z = (pSVar107->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    _local_218 = auVar178._0_32_;
    auStack_1f8._0_4_ = TStack_3e0.z;
    TStack_3e0.x = (pSVar107->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    TStack_3e0.y = (pSVar107->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auStack_200._0_4_ = TStack_3e0.x;
    auStack_200._4_4_ = TStack_3e0.y;
    auVar178 = _local_218;
    fStack_3cc = (pSVar107->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auStack_1e8 = auVar103._24_16_;
    _local_218 = auVar178._0_44_;
    uStack_1f0._4_4_ = fStack_3cc;
    uVar198._0_4_ = (pSVar107->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar198._4_4_ = (pSVar107->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    _local_218 = auVar178._0_36_;
    stack0xfffffffffffffe0c = uVar198;
    auVar178 = _local_218;
    afStack_214._4_8_ = TVar97.y;
    auVar197 = ZEXT856((ulong)afStack_214._4_8_);
    local_3f8 = TVar97._0_16_;
    IStack_208 = TVar97.z;
    IStack_3e8 = IStack_208;
    fStack_3d4 = (float)(undefined4)uVar198;
    fStack_3d0 = (float)uVar198._4_4_;
    _local_218 = auVar178;
    BVar104 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
              ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                          *)bsdf);
    if (((BVar104 & Reflection) == Unset) ||
       (BVar104 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                  ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                            ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                              *)bsdf), (BVar104 & Transmission) != Unset)) {
      BVar104 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                          ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                            *)bsdf);
      if ((BVar104 & Transmission) != Unset) {
        BVar104 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                  ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                            ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                              *)bsdf);
        if ((BVar104 & Reflection) == Unset) {
          uVar113._0_4_ = (intr->wo).super_Tuple3<pbrt::Vector3,_float>.x;
          uVar113._4_4_ = (intr->wo).super_Tuple3<pbrt::Vector3,_float>.y;
          auVar128._0_8_ = uVar113 ^ 0x8000000080000000;
          auVar128._8_4_ = 0x80000000;
          auVar128._12_4_ = 0x80000000;
          auVar197 = ZEXT856(auVar128._8_8_);
          pVVar110 = (Vector3f *)local_218;
          uVar198 = vmovlps_avx(auVar128);
          afStack_214[1] = -(intr->wo).super_Tuple3<pbrt::Vector3,_float>.z;
          _local_218 = uVar198;
          goto LAB_003feb72;
        }
      }
    }
    else {
      pVVar110 = &intr->wo;
LAB_003feb72:
      PVar322 = Interaction::OffsetRayOrigin(intr,pVVar110);
      auVar156._0_4_ = PVar322.super_Tuple3<pbrt::Point3,_float>.z;
      auVar178._0_8_ = PVar322.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar178._8_56_ = auVar197;
      auVar156._4_4_ = auVar156._0_4_;
      auVar156._8_4_ = auVar156._0_4_;
      auVar156._12_4_ = auVar156._0_4_;
      local_3f8 = vshufps_avx(auVar178._0_16_,auVar178._0_16_,0x50);
      IStack_3e8 = (Interval)vmovlps_avx(auVar156);
    }
  }
  _local_218 = (sampler->
               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
  u = DispatchSplit<9>::operator()
                ((DispatchSplit<9> *)local_370,local_218,(ulong)_local_218 >> 0x30);
  uVar113 = (local_3c8->lightSampler).
            super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
            .bits;
  sVar95 = (short)(uVar113 >> 0x30);
  if (uVar113 >> 0x30 < 3) {
    if (sVar95 == 2) {
      PowerLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_498,
                 (PowerLightSampler *)(uVar113 & 0xffffffffffff),u);
    }
    else {
      lVar111 = *(long *)((uVar113 & 0xffffffffffff) + 0x18);
      if (lVar111 == 0) {
        local_498._0_12_ = ZEXT412(0);
        local_498._12_4_ = 0;
        local_488._0_1_ = false;
        local_488._1_7_ = 0;
      }
      else {
        auVar129 = vcvtusi2ss_avx512f(auVar129,lVar111);
        iVar112 = (int)(u * auVar129._0_4_);
        iVar105 = (int)lVar111 + -1;
        if (iVar112 <= iVar105) {
          iVar105 = iVar112;
        }
        local_488._0_1_ = true;
        local_498._8_4_ = 1.0 / auVar129._0_4_;
        local_498._0_8_ =
             *(undefined8 *)(*(long *)((uVar113 & 0xffffffffffff) + 8) + (long)iVar105 * 8);
      }
    }
  }
  else if (sVar95 == 3) {
    BVHLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_498,
               (BVHLightSampler *)(uVar113 & 0xffffffffffff),(LightSampleContext *)local_3f8,u);
  }
  else {
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_498,
               (ExhaustiveLightSampler *)(uVar113 & 0xffffffffffff),(LightSampleContext *)local_3f8,
               u);
  }
  uVar113 = (sampler->
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
  this_01 = (DebugMLTSampler *)(uVar113 & 0xffffffffffff);
  uVar96 = (ushort)(uVar113 >> 0x30);
  if (uVar113 >> 0x30 < 5) {
    if (uVar113 < 0x3000000000000) {
      if (uVar96 == 2) {
        auVar179._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_01);
        auVar179._8_56_ = extraout_var_02;
        auVar129 = auVar179._0_16_;
      }
      else {
        auVar181._0_8_ = RandomSampler::Get2D((RandomSampler *)this_01);
        auVar181._8_56_ = extraout_var_06;
        auVar129 = auVar181._0_16_;
      }
    }
    else if (uVar96 == 3) {
      auVar180._0_8_ = HaltonSampler::Get2D((HaltonSampler *)this_01);
      auVar180._8_56_ = extraout_var_04;
      auVar129 = auVar180._0_16_;
    }
    else {
      auVar182._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_01);
      auVar182._8_56_ = extraout_var_08;
      auVar129 = auVar182._0_16_;
    }
  }
  else if (uVar96 < 7) {
    if (uVar96 == 6) {
      auVar296._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)this_01);
      auVar296._8_56_ = extraout_var_03;
      auVar129 = auVar296._0_16_;
    }
    else {
      auVar289._0_8_ = SobolSampler::Get2D((SobolSampler *)this_01);
      auVar289._8_56_ = extraout_var_07;
      auVar129 = auVar289._0_16_;
    }
  }
  else if (uVar113 >> 0x30 == 8) {
    auVar183._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
    auVar183._8_56_ = extraout_var_09;
    auVar129 = auVar183._0_16_;
  }
  else if (uVar96 == 7) {
    auVar307._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_01);
    auVar307._8_56_ = extraout_var_05;
    auVar129 = auVar307._0_16_;
  }
  else {
    local_578._0_4_ = DebugMLTSampler::Get1D(this_01);
    local_578._4_4_ = extraout_XMM0_Db;
    fStack_570 = (float)extraout_XMM0_Dc;
    fStack_56c = (float)extraout_XMM0_Dd;
    auVar288._0_4_ = DebugMLTSampler::Get1D(this_01);
    auVar288._4_60_ = extraout_var_00;
    auVar129 = vinsertps_avx(_local_578,auVar288._0_16_,0x10);
  }
  auVar178 = _local_218;
  uVar198 = 0;
  uVar251 = 0;
  if (local_488._0_1_ == false) goto LAB_0040284b;
  local_228 = (anon_struct_8_0_00000001_for___align)local_498._0_8_;
  if ((anon_struct_8_0_00000001_for___align)local_498._0_8_ ==
      (anon_struct_8_0_00000001_for___align)0x0) {
LAB_00402876:
    LogFatal<char_const(&)[43]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
               ,0x509,"Check failed: %s",(char (*) [43])"light != nullptr && sampledLight->pdf != 0"
              );
  }
  if (((float)local_498._8_4_ == 0.0) && (!NAN((float)local_498._8_4_))) goto LAB_00402876;
  auStack_1f8._4_4_ = fStack_3d4;
  auStack_1f8._0_4_ = TStack_3e0.z;
  uStack_1f0._4_4_ = fStack_3cc;
  uStack_1f0._0_4_ = fStack_3d0;
  _local_218 = auVar178._0_16_;
  IStack_208 = IStack_3e8;
  auStack_200._0_4_ = TStack_3e0.x;
  auStack_200._4_4_ = TStack_3e0.y;
  auStack_1e8 = auVar178._48_16_;
  auVar178 = _local_218;
  _local_218 = local_3f8;
  _auStack_1f8 = auVar178._32_32_;
  auStack_200._0_4_ = TStack_3e0.x;
  auStack_200._4_4_ = TStack_3e0.y;
  local_5d8 = *(undefined1 (*) [8])(lambda->lambda).values;
  uVar198 = *(undefined8 *)((lambda->lambda).values + 2);
  uVar251 = *(undefined8 *)(lambda->pdf).values;
  pRStack_5c0 = *(RNG **)((lambda->pdf).values + 2);
  local_370._16_8_ = local_5d8;
  uStack_5d0._0_4_ = (float)uVar198;
  uStack_5d0._4_4_ = (float)((ulong)uVar198 >> 0x20);
  uStack_5c8._0_4_ = (float)uVar251;
  uStack_5c8._4_4_ = (float)((ulong)uVar251 >> 0x20);
  local_370._8_8_ = &local_258;
  local_258 = (Interval)vmovlps_avx(auVar129);
  unique0x00005300 = &local_3b8;
  local_3b8.T_ray = (SampledSpectrum *)((ulong)local_3b8.T_ray._4_4_ << 0x20);
  local_500 = (anon_struct_8_0_00000001_for___align)local_498._0_8_;
  auVar178 = ZEXT1664(auVar130);
  auVar183 = ZEXT1664(auVar126);
  local_370._0_8_ = local_218;
  DispatchSplit<9>::operator()(&local_c8);
  uVar198 = 0;
  if (local_58 == '\x01') {
    if ((local_c8 == 0.0) && (!NAN(local_c8))) {
      uVar113 = 0;
      while (uVar116 = uVar113, uVar116 != 3) {
        if ((afStack_c4[uVar116] != 0.0) || (uVar113 = uVar116 + 1, NAN(afStack_c4[uVar116])))
        break;
      }
      if (2 < uVar116) goto LAB_00402835;
    }
    uVar251 = 0;
    if ((local_ac == 0.0) && (!NAN(local_ac))) goto LAB_0040284b;
    if (local_488._0_1_ == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    local_48 = ZEXT416((uint)(local_ac * (float)local_498._8_4_));
    local_408 = 0;
    uStack_400 = 0;
    pVVar110 = &intr->wo;
    uVar5 = (pVVar110->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar6 = (pVVar110->super_Tuple3<pbrt::Vector3,_float>).y;
    local_528._4_4_ = uVar6;
    local_528._0_4_ = uVar5;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_b0;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
    local_578._0_4_ = local_b0;
    local_5f8._0_4_ = (intr->wo).super_Tuple3<pbrt::Vector3,_float>.z;
    local_528._8_8_ = 0;
    uStack_590 = 0;
    local_598 = (undefined1  [8])local_b8;
    if (bsdf == (BSDF *)0x0) {
      fVar148 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.x;
      if (((((fVar148 != 0.0) || (NAN(fVar148))) ||
           (fVar148 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.y, fVar148 != 0.0)) ||
          ((NAN(fVar148) ||
           (fVar148 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.z, fVar148 != 0.0)))) ||
         (NAN(fVar148))) {
        LogFatal<char_const(&)[27]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                   ,0x51d,"Check failed: %s",(char (*) [27])"intr.IsMediumInteraction()");
      }
      pMVar108 = Interaction::AsMedium(intr);
      pfVar122 = (float *)((pMVar108->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits &
                          0xffffffffffff);
      auVar129._0_4_ = local_528._0_4_ * local_598._0_4_;
      auVar129._4_4_ = local_528._4_4_ * local_598._4_4_;
      auVar129._8_4_ = local_528._8_4_ * local_598._8_4_;
      auVar129._12_4_ = local_528._12_4_ * local_598._12_4_;
      auVar129 = vmovshdup_avx(auVar129);
      auVar129 = vfmadd231ss_fma(auVar129,local_528,_local_598);
      auVar130 = vfmadd132ss_fma(ZEXT416((uint)local_578._0_4_),auVar129,
                                 ZEXT416((uint)local_5f8._0_4_));
      fVar148 = *pfVar122;
      auVar129 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar148),
                                 ZEXT416((uint)fVar148));
      auVar126 = vfmadd213ss_fma(ZEXT416((uint)(fVar148 + fVar148)),auVar130,auVar129);
      auVar128 = ZEXT816(0) << 0x40;
      auVar129 = vmaxss_avx(auVar126,auVar128);
      local_578._0_4_ = auVar130._0_4_;
      if (auVar129._0_4_ < 0.0) {
        local_5f8._0_4_ = fVar148;
        local_528._0_4_ = auVar126._0_4_;
        fVar195 = sqrtf(auVar129._0_4_);
        auVar128 = ZEXT816(0) << 0x40;
        fVar148 = (float)local_5f8._0_4_;
        fVar194 = (float)local_528._0_4_;
      }
      else {
        auVar129 = vsqrtss_avx(auVar129,auVar129);
        fVar195 = auVar129._0_4_;
        fVar194 = auVar126._0_4_;
      }
      auVar130 = SUB6416(ZEXT464(0x3f800000),0);
      auVar129 = vfnmadd213ss_fma(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),auVar130);
      fVar148 = (auVar129._0_4_ * 0.07957747) / (fVar195 * fVar194);
      local_408 = CONCAT44(fVar148,fVar148);
      uStack_400 = CONCAT44(fVar148,fVar148);
      fVar148 = *pfVar122;
      auVar129 = vfmadd213ss_fma(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),auVar130);
      auVar129 = vfmadd213ss_fma(ZEXT416((uint)local_578._0_4_),ZEXT416((uint)(fVar148 + fVar148)),
                                 auVar129);
      auVar130 = vfnmadd213ss_fma(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),auVar130);
      fVar148 = auVar130._0_4_ * 0.07957747;
      local_578._0_4_ = auVar129._0_4_;
      auVar129 = vmaxss_avx(auVar129,auVar128);
      if (auVar129._0_4_ < 0.0) {
        local_5f8._0_4_ = fVar148;
        fVar194 = sqrtf(auVar129._0_4_);
        fVar148 = (float)local_5f8._0_4_;
      }
      else {
        auVar129 = vsqrtss_avx(auVar129,auVar129);
        fVar194 = auVar129._0_4_;
      }
      local_108 = fVar148 / (fVar194 * (float)local_578._0_4_);
      uStack_104 = 0;
      uStack_100 = 0;
      uStack_fc = 0;
    }
    else {
      auVar197 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      uVar198 = 0;
      SVar323 = BSDF::f(bsdf,(Vector3f)pVVar110->super_Tuple3<pbrt::Vector3,_float>,wiRender,
                        Radiance);
      auVar232._0_8_ = SVar323.values.values._8_8_;
      auVar232._8_56_ = auVar197;
      uStack_530 = uVar198;
      local_538 = (undefined1  [8])SVar323.values.values._0_8_;
      _local_548 = auVar232._0_16_;
      pSVar107 = Interaction::AsSurface(intr);
      auVar128 = local_528;
      fVar148 = (pSVar107->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar130 = vunpcklpd_avx(_local_538,_local_548);
      auVar129 = vmovshdup_avx(_local_598);
      auVar126 = ZEXT416((uint)((float)local_578._0_4_ * fVar148));
      auVar129 = vfmadd132ss_fma(auVar129,auVar126,
                                 ZEXT416((uint)(pSVar107->shading).n.
                                               super_Tuple3<pbrt::Normal3,_float>.y));
      auVar126 = vfmsub213ss_fma(ZEXT416((uint)fVar148),ZEXT416((uint)local_578._0_4_),auVar126);
      auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar129._0_4_ + auVar126._0_4_)),_local_598,
                                 ZEXT416((uint)(pSVar107->shading).n.
                                               super_Tuple3<pbrt::Normal3,_float>.x));
      auVar255._0_4_ = auVar129._0_4_;
      auVar255._4_4_ = auVar255._0_4_;
      auVar255._8_4_ = auVar255._0_4_;
      auVar255._12_4_ = auVar255._0_4_;
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      in_ZmmResult._0_16_ = vandps_avx512vl(auVar255,auVar126);
      local_408 = CONCAT44(in_ZmmResult._4_4_ * auVar130._4_4_,in_ZmmResult._0_4_ * auVar130._0_4_);
      uStack_400 = CONCAT44(in_ZmmResult._12_4_ * auVar130._12_4_,
                            in_ZmmResult._8_4_ * auVar130._8_4_);
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_5f8._0_4_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_528._0_4_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_528._4_4_;
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_598;
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_578._0_4_;
      local_528 = auVar128;
      local_108 = BSDF::PDF(bsdf,woRender,wiRender_00,Radiance,All);
      uStack_104 = extraout_XMM0_Db_00;
      uStack_100 = extraout_XMM0_Dc_00;
      uStack_fc = extraout_XMM0_Dd_00;
    }
    if (((float)local_408 == 0.0) && (!NAN((float)local_408))) {
      uVar113 = 0;
      while (uVar116 = uVar113, uVar116 != 3) {
        fVar148 = *(float *)((long)&local_408 + uVar116 * 4 + 4);
        if ((fVar148 != 0.0) || (uVar113 = uVar116 + 1, NAN(fVar148))) break;
      }
      uVar198 = 0;
      uVar251 = 0;
      if (2 < uVar116) goto LAB_0040284b;
    }
    if (local_58 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    Interaction::SpawnRayTo((Ray *)&local_258,intr,&local_a8);
    IVar100.high = IStack_250.high;
    IVar100.low = IStack_250.low;
    local_468.values.values[0] = 1.0;
    local_468.values.values[1] = 1.0;
    local_468.values.values[2] = 1.0;
    local_468.values.values[3] = 1.0;
    local_4c8.values.values[0] = 1.0;
    local_4c8.values.values[1] = 1.0;
    local_4c8.values.values[2] = 1.0;
    local_4c8.values.values[3] = 1.0;
    local_428.values.values[0] = 1.0;
    local_428.values.values[1] = 1.0;
    local_428.values.values[2] = 1.0;
    local_428.values.values[3] = 1.0;
    uVar113 = ((((ulong)((long)local_258 * -0x395b586ca42e166b) >> 0x2f ^
                (long)local_258 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
               -0x395b586ca42e166b ^ (ulong)(uint)IStack_250.low) * -0x395b586ca42e166b;
    uVar116 = (uVar113 >> 0x2f ^ uVar113) * -0x395b586ca42e166b;
    uVar116 = uVar116 >> 0x2f ^ uVar116;
    uVar113 = CONCAT44(fStack_248,IStack_250.high) * -0x395b586ca42e166b;
    uVar113 = (((uVar113 >> 0x2f ^ uVar113) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
               -0x395b586ca42e166b ^ uStack_244 & 0xffffffff) * -0x395b586ca42e166b;
    uVar113 = (uVar113 >> 0x2f ^ uVar113) * -0x395b586ca42e166b;
    local_518.inc = uVar116 * 2 + 1;
    local_518.state =
         ((uVar113 >> 0x2f ^ uVar113) + 1) * 0x5851f42d4c957f2d + uVar116 * -0x4f5c17a566d501a4 + 1;
    local_3c8 = (VolPathIntegrator *)
                &(local_3c8->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                 aggregate;
    local_3c0 = lambda;
    do {
      IStack_250.high = IVar100.high;
      if ((IStack_250.high == 0.0) && (fStack_248 == 0.0)) {
        if (((float)uStack_244 == 0.0) && (!NAN((float)uStack_244))) goto LAB_004026fa;
      }
      *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
      if ((((TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
             *)&local_3c8->super_RayIntegrator)->bits & 0xffffffffffff) == 0) {
        in_ZmmResult = ZEXT464(0) << 0x20;
        local_158 = in_ZmmResult;
        local_198 = in_ZmmResult;
        local_1d8 = in_ZmmResult;
        _local_218 = in_ZmmResult;
        local_118 = 0;
      }
      else {
        auVar178 = ZEXT1664(auVar178._0_16_);
        auVar183 = ZEXT1664(auVar183._0_16_);
        IStack_250 = IVar100;
        PrimitiveHandle::Intersect
                  ((optional<pbrt::ShapeIntersection> *)local_218,(PrimitiveHandle *)local_3c8,
                   (Ray *)&local_258,0.9999);
        IVar100 = IStack_250;
      }
      IStack_250.high = IVar100.high;
      IStack_250.low = IVar100.low;
      auVar130 = auVar183._0_16_;
      auVar129 = auVar178._0_16_;
      if ((local_118._0_1_ != true) ||
         (iVar105 = 1, (local_158 & (undefined1  [64])0xffffffffffff) == (undefined1  [64])0x0)) {
        if (local_238.bits != 0) {
          fVar148 = (float)((uint)(local_118._0_1_ & 1) * local_158._56_4_ +
                           (uint)!(bool)(local_118._0_1_ & 1) * 0x3f7ff972);
          auVar132._8_8_ = 0;
          auVar132._0_4_ = local_258.low;
          auVar132._4_4_ = local_258.high;
          auVar297._4_4_ = fStack_248;
          auVar297._0_4_ = IStack_250.high;
          auVar297._8_8_ = 0;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = uStack_244;
          uVar106 = (uint)(local_518.state >> 0x2d) ^ (uint)(local_518.state >> 0x1b);
          uVar113 = local_518.state * 0x5851f42d4c957f2d + local_518.inc;
          bVar109 = (byte)(local_518.state >> 0x3b);
          auVar126 = vcvtusi2ss_avx512f(auVar130,uVar106 >> bVar109 | uVar106 << 0x20 - bVar109);
          auVar126 = vminss_avx(ZEXT416((uint)(auVar126._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
          ;
          local_438._0_8_ = local_238.bits;
          local_528._0_4_ = auVar126._0_4_;
          sVar95 = (short)(local_238.bits >> 0x30);
          local_518.state = uVar113;
          IStack_250 = IVar100;
          if (local_238.bits < 0x3000000000000) {
            if (sVar95 == 2) {
              local_500 = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar132);
              local_4f8 = IStack_250.low;
              _local_4f4 = vmovlhps_avx(auVar297,auVar131);
              local_4e0.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                         )local_238.bits;
              local_3b8.T_ray = &local_468;
              local_3b8.lightPathPDF = &local_4c8;
              local_3b8.uniPathPDF = &local_428;
              local_3b8.rng = &local_518;
              puVar121 = (undefined8 *)(local_238.bits & 0xffffffffffff);
              auVar178 = ZEXT1664(auVar129);
              auVar183 = ZEXT1664(auVar130);
              local_5fc = fVar148;
              Transform::ApplyInverse
                        ((Ray *)local_5d8,(Transform *)(puVar121 + 0xf),(Ray *)&local_500,&local_5fc
                        );
              auVar199._0_4_ = (float)uStack_5c8 * (float)uStack_5c8;
              auVar199._4_4_ = uStack_5c8._4_4_ * uStack_5c8._4_4_;
              auVar199._8_8_ = 0;
              auVar129 = vmovshdup_avx(auVar199);
              fVar148 = uStack_5d0._4_4_ * uStack_5d0._4_4_ + auVar199._0_4_ + auVar129._0_4_;
              if (fVar148 < 0.0) {
                fVar148 = sqrtf(fVar148);
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              else {
                auVar129 = vsqrtss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                fVar148 = auVar129._0_4_;
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              uStack_5c8._4_4_ = (float)((ulong)pSVar99 >> 0x20);
              uStack_5c8._0_4_ = SUB84(pSVar99,0);
              uStack_5d0._4_4_ = (float)((ulong)pSVar98 >> 0x20);
              local_5fc = fVar148 * local_5fc;
              auVar201._0_4_ = (float)uStack_5c8 * (float)uStack_5c8;
              auVar201._4_4_ = uStack_5c8._4_4_ * uStack_5c8._4_4_;
              auVar201._8_8_ = 0;
              auVar129 = vmovshdup_avx(auVar201);
              fVar148 = uStack_5d0._4_4_ * uStack_5d0._4_4_ + auVar201._0_4_ + auVar129._0_4_;
              if (fVar148 < 0.0) {
                uStack_5d0 = pSVar98;
                uStack_5c8 = pSVar99;
                fVar148 = sqrtf(fVar148);
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              else {
                auVar129 = vsqrtss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                fVar148 = auVar129._0_4_;
              }
              uStack_5c8._4_4_ = (float)((ulong)pSVar99 >> 0x20);
              uStack_5c8._0_4_ = SUB84(pSVar99,0);
              uStack_5d0._4_4_ = (float)((ulong)pSVar98 >> 0x20);
              uStack_5d0._0_4_ = SUB84(pSVar98,0);
              auVar204._4_4_ = (float)uStack_5c8;
              auVar204._0_4_ = uStack_5d0._4_4_;
              auVar204._8_8_ = 0;
              auVar252._4_4_ = fVar148;
              auVar252._0_4_ = fVar148;
              auVar252._8_4_ = fVar148;
              auVar252._12_4_ = fVar148;
              auVar129 = vdivps_avx(auVar204,auVar252);
              uVar198 = vmovlps_avx(auVar129);
              uStack_5d0._4_4_ = (float)uVar198;
              uStack_5c8._0_4_ = (float)((ulong)uVar198 >> 0x20);
              uStack_5c8._4_4_ = uStack_5c8._4_4_ / fVar148;
              auVar288 = ZEXT464((uint)local_5fc);
              auVar129 = ZEXT816(0) << 0x40;
              bVar123 = false;
              uVar106 = 0;
              do {
                pfVar122 = (float *)((long)&uStack_5d0 + 4);
                if ((uVar106 != 0) && (pfVar122 = (float *)&uStack_5c8, uVar106 != 1)) {
                  pfVar122 = (float *)((long)&uStack_5c8 + 4);
                }
                pfVar114 = (float *)(puVar121 + 1);
                if ((uVar106 != 0) && (pfVar114 = (float *)((long)puVar121 + 0xc), uVar106 != 1)) {
                  pfVar114 = (float *)(puVar121 + 2);
                }
                pRVar118 = (Ray *)local_5d8;
                if ((uVar106 != 0) && (pRVar118 = (Ray *)(local_5d8 + 4), uVar106 != 1)) {
                  pRVar118 = (Ray *)&uStack_5d0;
                }
                pfVar119 = (float *)((long)puVar121 + 0x14);
                if ((uVar106 != 0) && (pfVar119 = (float *)(puVar121 + 3), uVar106 != 1)) {
                  pfVar119 = (float *)((long)puVar121 + 0x1c);
                }
                pRVar120 = (Ray *)local_5d8;
                if ((uVar106 != 0) && (pRVar120 = (Ray *)(local_5d8 + 4), uVar106 != 1)) {
                  pRVar120 = (Ray *)&uStack_5d0;
                }
                auVar197 = (undefined1  [56])0x0;
                auVar126 = ZEXT416((uint)((1.0 / *pfVar122) *
                                         (*pfVar119 -
                                         (pRVar120->o).super_Tuple3<pbrt::Point3,_float>.x)));
                auVar128 = ZEXT416((uint)((1.0 / *pfVar122) *
                                         (*pfVar114 -
                                         (pRVar118->o).super_Tuple3<pbrt::Point3,_float>.x)));
                auVar130 = vminss_avx(auVar126,auVar128);
                auVar129 = vmaxss_avx(auVar130,auVar129);
                auVar130 = vmaxss_avx(auVar128,auVar126);
                auVar130 = vminss_avx(ZEXT416((uint)(auVar130._0_4_ * 1.0000004)),auVar288._0_16_);
                auVar288 = ZEXT1664(auVar130);
                if (auVar130._0_4_ < auVar129._0_4_) break;
                bVar123 = 1 < uVar106;
                uVar106 = uVar106 + 1;
              } while (uVar106 != 3);
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              if (bVar123) {
                local_5f8._0_4_ = auVar129._0_4_;
                local_558._0_4_ = auVar130._0_4_;
                uVar198 = 0;
                _local_578 = ZEXT416(*(uint *)(puVar121 + 0xe));
                SVar323 = DenselySampledSpectrum::Sample
                                    ((DenselySampledSpectrum *)(puVar121 + 4),lambda);
                auVar235._0_8_ = SVar323.values.values._8_8_;
                auVar235._8_56_ = auVar197;
                uStack_590 = uVar198;
                local_598 = (undefined1  [8])SVar323.values.values._0_8_;
                _local_538 = auVar235._0_16_;
                auVar248 = (undefined1  [56])0x0;
                _local_548 = ZEXT416(*(uint *)(puVar121 + 0xe));
                SVar323 = DenselySampledSpectrum::Sample
                                    ((DenselySampledSpectrum *)(puVar121 + 9),lambda);
                auVar236._0_8_ = SVar323.values.values._8_8_;
                auVar236._8_56_ = auVar197;
                auVar186._0_8_ = SVar323.values.values._0_8_;
                auVar186._8_56_ = auVar248;
                auVar129 = vunpcklpd_avx(_local_598,_local_538);
                local_268 = (float)local_578._0_4_ * auVar129._0_4_;
                fStack_264 = (float)local_578._0_4_ * auVar129._4_4_;
                fStack_260 = (float)local_578._0_4_ * auVar129._8_4_;
                fStack_25c = (float)local_578._0_4_ * auVar129._12_4_;
                auVar129 = vmovlhps_avx(auVar186._0_16_,auVar236._0_16_);
                fVar148 = (float)local_548._0_4_ * auVar129._0_4_;
                fVar194 = (float)local_548._0_4_ * auVar129._4_4_;
                fStack_270 = (float)local_548._0_4_ * auVar129._8_4_;
                fStack_26c = (float)local_548._0_4_ * auVar129._12_4_;
                local_278 = CONCAT44(fVar194,fVar148);
                local_2c8._0_4_ = fVar148 + local_268;
                local_2c8._4_4_ = fVar194 + fStack_264;
                local_2c8._8_4_ = fStack_270 + fStack_260;
                local_2c8._12_4_ = fStack_26c + fStack_25c;
                auVar307 = ZEXT1664(local_2c8);
                fVar148 = *(float *)(puVar121 + 2);
                fVar308 = *(float *)((long)puVar121 + 0x1c) - fVar148;
                uVar198 = vcmpss_avx512f(ZEXT416((uint)fVar148),
                                         ZEXT416((uint)*(float *)((long)puVar121 + 0x1c)),1);
                bVar10 = (bool)((byte)uVar198 & 1);
                auVar153._8_8_ = 0;
                auVar153._0_8_ = puVar121[1];
                auVar205._8_8_ = 0;
                auVar205._0_8_ = *(ulong *)((long)puVar121 + 0x14);
                auVar129 = vsubps_avx(auVar205,auVar153);
                auVar298._8_8_ = 0;
                auVar298._0_8_ = local_5d8;
                auVar130 = vsubps_avx(auVar298,auVar153);
                uVar113 = vcmpps_avx512vl(auVar153,auVar205,1);
                auVar126 = vdivps_avx512vl(auVar130,auVar129);
                bVar123 = (bool)((byte)uVar113 & 1);
                auVar127._0_4_ =
                     (float)((uint)bVar123 * auVar126._0_4_ | (uint)!bVar123 * auVar130._0_4_);
                bVar123 = (bool)((byte)(uVar113 >> 1) & 1);
                auVar127._4_4_ = (uint)bVar123 * auVar126._4_4_ | (uint)!bVar123 * auVar130._4_4_;
                bVar123 = (bool)((byte)(uVar113 >> 2) & 1);
                auVar127._8_4_ = (uint)bVar123 * auVar126._8_4_ | (uint)!bVar123 * auVar130._8_4_;
                bVar123 = (bool)((byte)(uVar113 >> 3) & 1);
                auVar127._12_4_ = (uint)bVar123 * auVar126._12_4_ | (uint)!bVar123 * auVar130._12_4_
                ;
                in_ZmmResult._0_16_ = auVar127;
                auVar130 = vmovshdup_avx(auVar127);
                auVar154._4_4_ = (float)uStack_5c8;
                auVar154._0_4_ = uStack_5d0._4_4_;
                auVar154._8_8_ = 0;
                auVar129 = vdivps_avx(auVar154,auVar129);
                local_504 = uStack_5c8._4_4_ / fVar308;
                local_5b0 = vmovlps_avx(auVar129);
                MVar101.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                         )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                           )local_5b0;
                auVar288 = ZEXT464((uint)local_5f8._0_4_);
                local_5b0._4_4_ = (float)(local_5b0 >> 0x20);
                fVar194 = (float)local_5f8._0_4_ * (float)local_5b0 + auVar127._0_4_;
                fVar195 = (float)local_5f8._0_4_ * local_5b0._4_4_ + auVar130._0_4_;
                fVar148 = (float)((uint)bVar10 * (int)(((float)uStack_5d0 - fVar148) / fVar308) +
                                 (uint)!bVar10 * (int)((float)uStack_5d0 - fVar148)) +
                          (float)local_5f8._0_4_ * local_504;
                piVar1 = (int *)(puVar121 + 0x23);
                piVar2 = (int *)((long)puVar121 + 0x11c);
                piVar3 = (int *)(puVar121 + 0x24);
                lVar111 = 0;
                pfVar122 = (float *)((long)&local_5b0 + 4);
                local_5b0 = (uintptr_t)
                            MVar101.
                            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                            .bits;
                do {
                  iVar105 = (int)lVar111;
                  fVar308 = fVar194;
                  if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                    fVar308 = fVar148;
                  }
                  piVar115 = piVar1;
                  if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                    piVar115 = piVar3;
                  }
                  piVar117 = piVar1;
                  if ((iVar105 != 0) && (piVar117 = piVar2, iVar105 != 1)) {
                    piVar117 = piVar3;
                  }
                  auVar290._0_4_ = (float)(*piVar117 + -1);
                  auVar290._4_12_ = auVar178._4_12_;
                  auVar129 = vminss_avx(auVar290,ZEXT416((uint)(fVar308 * (float)*piVar115)));
                  uVar198 = vcmpss_avx512f(ZEXT416((uint)(fVar308 * (float)*piVar115)),
                                           ZEXT816(0) << 0x40,1);
                  auVar136._16_48_ = in_ZmmResult._16_48_;
                  auVar136._0_16_ = auVar129;
                  fVar308 = (float)((uint)!(bool)((byte)uVar198 & 1) * auVar129._0_4_);
                  in_ZmmResult._4_60_ = auVar136._4_60_;
                  in_ZmmResult._0_4_ = fVar308;
                  iVar112 = (int)fVar308;
                  local_584[lVar111] = iVar112;
                  pfVar114 = (float *)&local_5b0;
                  if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                    pfVar114 = &local_504;
                  }
                  if ((*pfVar114 == 0.0) && (!NAN(*pfVar114))) {
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    *pfVar114 = 0.0;
                  }
                  auVar177 = _local_578;
                  pfVar114 = (float *)&local_5b0;
                  if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                    pfVar114 = &local_504;
                  }
                  if (0.0 <= *pfVar114) {
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    fVar308 = fVar194;
                    if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                      fVar308 = fVar148;
                    }
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    local_5e4[lVar111] =
                         (float)local_5f8._0_4_ +
                         ((float)(iVar112 + 1) / (float)*piVar115 - fVar308) / *pfVar114;
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    afStack_4a4[lVar111] = 1.0 / ((float)*piVar115 * *pfVar114);
                    aiStack_4b0[lVar111] = 1;
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    iVar105 = *piVar115;
                  }
                  else {
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    fVar308 = fVar194;
                    if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                      fVar308 = fVar148;
                    }
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    local_5e4[lVar111] =
                         (float)local_5f8._0_4_ +
                         ((float)iVar112 / (float)*piVar115 - fVar308) / *pfVar114;
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    afStack_4a4[lVar111] = -1.0 / ((float)*piVar115 * *pfVar114);
                    aiStack_4b0[lVar111] = -1;
                    iVar105 = -1;
                  }
                  aiStack_394[lVar111] = iVar105;
                  lVar111 = lVar111 + 1;
                } while (lVar111 != 3);
                fStack_570 = 1.0;
                local_578 = (undefined1  [8])0x3f8000003f800000;
                auStack_568 = auVar177._16_16_;
                fStack_56c = 1.0;
                auVar296 = ZEXT464((uint)local_528._0_4_);
                auVar289 = ZEXT464((uint)local_558._0_4_);
                do {
                  auVar177 = _local_578;
                  auVar130 = auVar288._0_16_;
                  iVar105 = *(int *)(&DAT_005841e0 +
                                    (ulong)((uint)(local_5e4[1] < local_5e4[2]) |
                                           (uint)(local_5e4[0] < local_5e4[1]) * 4 +
                                           (uint)(local_5e4[0] < local_5e4[2]) * 2) * 4);
                  uVar4 = *(undefined4 *)
                           (puVar121[0x20] +
                           (((long)local_584[2] * (long)*(int *)((long)puVar121 + 0x11c) +
                            (long)local_584[1]) * (long)*(int *)(puVar121 + 0x23) +
                           (long)local_584[0]) * 4);
                  auVar11._4_4_ = uVar4;
                  auVar11._0_4_ = uVar4;
                  auVar11._8_4_ = uVar4;
                  auVar11._12_4_ = uVar4;
                  auVar126 = vmulps_avx512vl(auVar307._0_16_,auVar11);
                  auVar129 = vminss_avx(ZEXT416((uint)local_5e4[iVar105]),auVar289._0_16_);
                  auVar12._8_4_ = 0x80000000;
                  auVar12._0_8_ = 0x8000000080000000;
                  auVar12._12_4_ = 0x80000000;
                  in_ZmmResult._0_16_ = vxorps_avx512vl(auVar126,auVar12);
                  if ((auVar126._0_4_ != 0.0) || (NAN(auVar126._0_4_))) {
                    local_538._0_4_ = auVar129._0_4_;
                    local_5f8._0_4_ = auVar288._0_4_;
                    _local_598 = auVar126;
                    _local_548 = in_ZmmResult._0_16_;
                    do {
                      fVar148 = logf(1.0 - auVar296._0_4_);
                      uVar102 = local_518.state;
                      auVar177 = _local_578;
                      fVar148 = (float)local_5f8._0_4_ - fVar148 / (float)local_598._0_4_;
                      local_518.state = local_518.state * 0x5851f42d4c957f2d + local_518.inc;
                      uVar106 = (uint)(uVar102 >> 0x2d) ^ (uint)(uVar102 >> 0x1b);
                      bVar109 = (byte)(uVar102 >> 0x3b);
                      auVar129 = vcvtusi2ss_avx512f(in_XMM14,uVar106 >> bVar109 |
                                                             uVar106 << 0x20 - bVar109);
                      auVar129 = vminss_avx(ZEXT416((uint)(auVar129._0_4_ * 2.3283064e-10)),
                                            ZEXT416(0x3f7fffff));
                      auVar296 = ZEXT1664(auVar129);
                      if ((float)local_538._0_4_ <= fVar148) {
                        fVar148 = (float)local_538._0_4_ - (float)local_5f8._0_4_;
                        auVar158._0_4_ = fVar148 * (float)local_548._0_4_;
                        auVar158._4_4_ = fVar148 * (float)local_548._4_4_;
                        auVar158._8_4_ = fVar148 * fStack_540;
                        auVar158._12_4_ = fVar148 * fStack_53c;
                        auVar27._8_4_ = 0x3fb8aa3b;
                        auVar27._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar27._12_4_ = 0x3fb8aa3b;
                        auVar130 = vmulps_avx512vl(auVar158,auVar27);
                        auVar129 = vroundps_avx(auVar130,9);
                        auVar130 = vsubps_avx(auVar130,auVar129);
                        auVar210._0_4_ = (int)auVar129._0_4_;
                        auVar210._4_4_ = (int)auVar129._4_4_;
                        auVar210._8_4_ = (int)auVar129._8_4_;
                        auVar210._12_4_ = (int)auVar129._12_4_;
                        auVar254._8_4_ = 0x3da00ac9;
                        auVar254._0_8_ = 0x3da00ac93da00ac9;
                        auVar254._12_4_ = 0x3da00ac9;
                        auVar28._8_4_ = 0x3e679a0b;
                        auVar28._0_8_ = 0x3e679a0b3e679a0b;
                        auVar28._12_4_ = 0x3e679a0b;
                        auVar129 = vfmadd213ps_avx512vl(auVar254,auVar130,auVar28);
                        auVar29._8_4_ = 0x3f321004;
                        auVar29._0_8_ = 0x3f3210043f321004;
                        auVar29._12_4_ = 0x3f321004;
                        auVar129 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar29);
                        auVar30._8_4_ = 0x3f800000;
                        auVar30._0_8_ = 0x3f8000003f800000;
                        auVar30._12_4_ = 0x3f800000;
                        auVar130 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar30);
                        auVar126 = vpsrld_avx(auVar130,0x17);
                        auVar274._8_4_ = 0xffffff81;
                        auVar274._0_8_ = 0xffffff81ffffff81;
                        auVar274._12_4_ = 0xffffff81;
                        auVar129 = vpaddd_avx(auVar210,auVar274);
                        auVar129 = vpaddd_avx(auVar129,auVar126);
                        uVar113 = vpcmpgtd_avx512vl(auVar129,auVar274);
                        uVar113 = uVar113 & 0xf;
                        auVar31._8_4_ = 0x7f;
                        auVar31._0_8_ = 0x7f0000007f;
                        auVar31._12_4_ = 0x7f;
                        uVar116 = vpcmpgtd_avx512vl(auVar129,auVar31);
                        uVar116 = uVar116 & 0xf;
                        auVar32._8_4_ = 0x807fffff;
                        auVar32._0_8_ = 0x807fffff807fffff;
                        auVar32._12_4_ = 0x807fffff;
                        auVar130 = vpandd_avx512vl(auVar130,auVar32);
                        auVar129 = vpslld_avx(auVar129,0x17);
                        auVar33._8_4_ = 0x3f800000;
                        auVar33._0_8_ = 0x3f8000003f800000;
                        auVar33._12_4_ = 0x3f800000;
                        auVar129 = vpaddd_avx512vl(auVar129,auVar33);
                        auVar129 = vpord_avx512vl(auVar129,auVar130);
                        auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar123 = (bool)((byte)uVar116 & 1);
                        in_ZmmResult._0_4_ =
                             (float)((uint)bVar123 * auVar130._0_4_ |
                                    (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar129._0_4_);
                        bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
                        in_ZmmResult._4_4_ =
                             (float)((uint)bVar123 * auVar130._4_4_ |
                                    (uint)!bVar123 *
                                    (uint)((byte)(uVar113 >> 1) & 1) * auVar129._4_4_);
                        bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
                        in_ZmmResult._8_4_ =
                             (float)((uint)bVar123 * auVar130._8_4_ |
                                    (uint)!bVar123 *
                                    (uint)((byte)(uVar113 >> 2) & 1) * auVar129._8_4_);
                        bVar123 = SUB81(uVar116 >> 3,0);
                        in_ZmmResult._12_4_ =
                             (float)((uint)bVar123 * auVar130._12_4_ |
                                    (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar129._12_4_);
                        local_578._4_4_ = in_ZmmResult._4_4_ * (float)local_578._4_4_;
                        local_578._0_4_ = in_ZmmResult._0_4_ * (float)local_578._0_4_;
                        fStack_570 = in_ZmmResult._8_4_ * fStack_570;
                        auStack_568 = auVar177._16_16_;
                        fStack_56c = in_ZmmResult._12_4_ * fStack_56c;
                        cVar124 = '\n';
                      }
                      else {
                        cVar124 = '\0';
                        if ((float)local_558._0_4_ <= fVar148) {
                          local_5f8._0_4_ = fVar148;
                        }
                        else {
                          local_528._0_4_ = auVar129._0_4_;
                          fVar194 = fVar148 - (float)local_5f8._0_4_;
                          auVar157._0_4_ = fVar194 * (float)local_548._0_4_;
                          auVar157._4_4_ = fVar194 * (float)local_548._4_4_;
                          auVar157._8_4_ = fVar194 * fStack_540;
                          auVar157._12_4_ = fVar194 * fStack_53c;
                          auVar20._8_4_ = 0x3fb8aa3b;
                          auVar20._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar20._12_4_ = 0x3fb8aa3b;
                          auVar129 = vmulps_avx512vl(auVar157,auVar20);
                          _local_458 = vroundps_avx(auVar129,9);
                          auVar129 = vsubps_avx(auVar129,_local_458);
                          auVar207._8_4_ = 0x3da00ac9;
                          auVar207._0_8_ = 0x3da00ac93da00ac9;
                          auVar207._12_4_ = 0x3da00ac9;
                          auVar21._8_4_ = 0x3e679a0b;
                          auVar21._0_8_ = 0x3e679a0b3e679a0b;
                          auVar21._12_4_ = 0x3e679a0b;
                          auVar130 = vfmadd213ps_avx512vl(auVar207,auVar129,auVar21);
                          auVar22._8_4_ = 0x3f321004;
                          auVar22._0_8_ = 0x3f3210043f321004;
                          auVar22._12_4_ = 0x3f321004;
                          auVar130 = vfmadd213ps_avx512vl(auVar130,auVar129,auVar22);
                          auVar23._8_4_ = 0x3f800000;
                          auVar23._0_8_ = 0x3f8000003f800000;
                          auVar23._12_4_ = 0x3f800000;
                          _local_448 = vfmadd213ps_avx512vl(auVar130,auVar129,auVar23);
                          _local_418 = ZEXT416((uint)fVar148);
                          auVar208._0_4_ = fVar148 * uStack_5d0._4_4_ + local_5d8._0_4_;
                          auVar208._4_4_ = fVar148 * (float)uStack_5c8 + local_5d8._4_4_;
                          auVar208._8_4_ = fVar148 * 0.0 + 0.0;
                          auVar208._12_4_ = fVar148 * 0.0 + 0.0;
                          uVar251 = auVar208._8_8_;
                          local_5a8.super_Tuple3<pbrt::Point3,_float>.z =
                               fVar148 * uStack_5c8._4_4_ + (float)uStack_5d0;
                          uVar196 = 0;
                          uVar198 = vmovlps_avx(auVar208);
                          local_5a8.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar198;
                          local_5a8.super_Tuple3<pbrt::Point3,_float>.y =
                               (float)((ulong)uVar198 >> 0x20);
                          SVar323 = UniformGridMediumProvider::Density
                                              ((UniformGridMediumProvider *)*puVar121,&local_5a8,
                                               lambda);
                          local_4d8._8_8_ = uVar196;
                          local_4d8._0_8_ = SVar323.values.values._0_8_;
                          local_478._8_8_ = uVar251;
                          local_478._0_8_ = SVar323.values.values._8_8_;
                          p.super_Tuple3<pbrt::Point3,_float>.y =
                               local_5a8.super_Tuple3<pbrt::Point3,_float>.y;
                          p.super_Tuple3<pbrt::Point3,_float>.x =
                               local_5a8.super_Tuple3<pbrt::Point3,_float>.x;
                          p.super_Tuple3<pbrt::Point3,_float>.z =
                               local_5a8.super_Tuple3<pbrt::Point3,_float>.z;
                          auVar248 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                          auVar197 = ZEXT856(0);
                          SVar323 = UniformGridMediumProvider::Le
                                              ((UniformGridMediumProvider *)*puVar121,p,lambda);
                          auVar237._0_8_ = SVar323.values.values._8_8_;
                          auVar237._8_56_ = auVar248;
                          auVar187._0_8_ = SVar323.values.values._0_8_;
                          auVar187._8_56_ = auVar197;
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0x7c))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0xf)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x10)));
                          fVar148 = auVar129._0_4_ + *(float *)((long)puVar121 + 0x84);
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0x8c))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0x11)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x12)));
                          fVar194 = auVar129._0_4_ + *(float *)((long)puVar121 + 0x94);
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0x9c))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0x13)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x14)));
                          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0xac))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0x15)));
                          auVar130 = vfmadd231ss_fma(auVar130,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x16)));
                          fVar195 = auVar130._0_4_ + *(float *)((long)puVar121 + 0xb4);
                          bVar123 = fVar195 == 1.0;
                          fVar308 = auVar129._0_4_ + *(float *)((long)puVar121 + 0xa4);
                          auVar209._0_4_ = local_4f4._4_4_ * local_4f4._4_4_;
                          auVar209._4_4_ = local_4f4._8_4_ * local_4f4._8_4_;
                          auVar209._8_8_ = 0;
                          auVar129 = vmovshdup_avx(auVar209);
                          fVar149 = (float)local_4f4._0_4_ * (float)local_4f4._0_4_ + auVar209._0_4_
                                    + auVar129._0_4_;
                          if (fVar149 < 0.0) {
                            local_2a8 = ZEXT416((uint)fVar148);
                            local_2b8 = ZEXT416((uint)fVar194);
                            local_388 = ZEXT416((uint)fVar308);
                            local_508 = fVar195;
                            local_298 = auVar237._0_16_;
                            local_288 = auVar187._0_16_;
                            fVar149 = sqrtf(fVar149);
                            fVar195 = local_508;
                            auVar129 = local_288;
                            auVar130 = local_298;
                            auVar126 = local_2a8;
                            auVar128 = local_388;
                            fVar194 = (float)local_2b8._0_4_;
                          }
                          else {
                            auVar129 = vsqrtss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
                            fVar149 = auVar129._0_4_;
                            auVar129 = auVar187._0_16_;
                            auVar130 = auVar237._0_16_;
                            auVar126 = ZEXT416((uint)fVar148);
                            auVar128 = ZEXT416((uint)fVar308);
                          }
                          auVar211._0_4_ = (int)(float)local_458._0_4_;
                          auVar211._4_4_ = (int)(float)local_458._4_4_;
                          auVar211._8_4_ = (int)fStack_450;
                          auVar211._12_4_ = (int)fStack_44c;
                          auVar255 = vpsrld_avx(_local_448,0x17);
                          auVar275._8_4_ = 0xffffff81;
                          auVar275._0_8_ = 0xffffff81ffffff81;
                          auVar275._12_4_ = 0xffffff81;
                          auVar156 = vpaddd_avx(auVar211,auVar275);
                          auVar156 = vpaddd_avx(auVar156,auVar255);
                          uVar113 = vpcmpgtd_avx512vl(auVar156,auVar275);
                          uVar113 = uVar113 & 0xf;
                          auVar24._8_4_ = 0x7f;
                          auVar24._0_8_ = 0x7f0000007f;
                          auVar24._12_4_ = 0x7f;
                          uVar116 = vpcmpgtd_avx512vl(auVar156,auVar24);
                          uVar116 = uVar116 & 0xf;
                          auVar25._8_4_ = 0x807fffff;
                          auVar25._0_8_ = 0x807fffff807fffff;
                          auVar25._12_4_ = 0x807fffff;
                          auVar255 = vpandd_avx512vl(_local_448,auVar25);
                          auVar156 = vpslld_avx(auVar156,0x17);
                          auVar26._8_4_ = 0x3f800000;
                          auVar26._0_8_ = 0x3f8000003f800000;
                          auVar26._12_4_ = 0x3f800000;
                          auVar156 = vpaddd_avx512vl(auVar156,auVar26);
                          auVar131 = vpord_avx512vl(auVar156,auVar255);
                          auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                          bVar10 = (bool)((byte)uVar116 & 1);
                          bVar7 = (bool)((byte)(uVar116 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar116 >> 2) & 1);
                          bVar9 = SUB81(uVar116 >> 3,0);
                          auVar156 = vmovlhps_avx(local_4d8,local_478);
                          auVar276._0_4_ = auVar156._0_4_ * local_268;
                          auVar276._4_4_ = auVar156._4_4_ * fStack_264;
                          auVar276._8_4_ = auVar156._8_4_ * fStack_260;
                          auVar276._12_4_ = auVar156._12_4_ * fStack_25c;
                          auVar255 = vshufpd_avx(auVar276,auVar276,1);
                          auVar256._0_4_ = auVar156._0_4_ * (float)local_278;
                          auVar256._4_4_ = auVar156._4_4_ * local_278._4_4_;
                          auVar256._8_4_ = auVar156._8_4_ * fStack_270;
                          auVar256._12_4_ = auVar156._12_4_ * fStack_26c;
                          auVar156 = vshufpd_avx(auVar256,auVar256,1);
                          fVar148 = auVar126._0_4_ / fVar195;
                          auVar138._4_12_ = auVar126._4_12_;
                          auVar138._0_4_ = fVar148;
                          fVar308 = auVar128._0_4_ / fVar195;
                          auVar139._4_12_ = auVar128._4_12_;
                          auVar139._0_4_ = fVar308;
                          auVar138._16_48_ = in_ZmmResult._16_48_;
                          auVar137._4_60_ = auVar138._4_60_;
                          auVar137._0_4_ =
                               (uint)bVar123 * (int)auVar126._0_4_ + (uint)!bVar123 * (int)fVar148;
                          iVar112 = (uint)bVar123 * (int)fVar194 +
                                    (uint)!bVar123 * (int)(fVar194 / fVar195);
                          auVar139._16_48_ = in_ZmmResult._16_48_;
                          in_ZmmResult._4_60_ = auVar139._4_60_;
                          in_ZmmResult._0_4_ =
                               (float)((uint)bVar123 * (int)auVar128._0_4_ +
                                      (uint)!bVar123 * (int)fVar308);
                          auVar313._0_8_ = local_4f4._0_8_ ^ 0x8000000080000000;
                          auVar313._8_4_ = 0x80000000;
                          auVar313._12_4_ = 0x80000000;
                          auVar316._4_4_ = fVar149;
                          auVar316._0_4_ = fVar149;
                          auVar316._8_4_ = fVar149;
                          auVar316._12_4_ = fVar149;
                          auVar126 = vdivps_avx(auVar313,auVar316);
                          auVar317._0_4_ = -(float)local_4f4._8_4_;
                          auVar317._4_4_ = 0x80000000;
                          auVar317._8_4_ = 0x80000000;
                          auVar317._12_4_ = 0x80000000;
                          auVar159._0_4_ = auVar317._0_4_ / fVar149;
                          auVar159._4_12_ = auVar317._4_12_;
                          auVar302._4_4_ = iVar112;
                          auVar302._0_4_ = iVar112;
                          auVar302._8_4_ = iVar112;
                          auVar302._12_4_ = iVar112;
                          auVar309._4_4_ = in_ZmmResult._0_4_;
                          auVar309._0_4_ = in_ZmmResult._0_4_;
                          auVar309._8_4_ = in_ZmmResult._0_4_;
                          auVar309._12_4_ = in_ZmmResult._0_4_;
                          local_348 = ZEXT816(0);
                          local_338 = 0.0;
                          auVar128 = vshufps_avx(auVar137._0_16_,auVar302,0x40);
                          local_370._0_8_ = auVar128._0_8_;
                          local_370._8_4_ = auVar128._8_4_;
                          local_370._12_4_ = auVar128._12_4_;
                          uVar198 = vmovlps_avx(auVar309);
                          local_370._16_4_ = (undefined4)uVar198;
                          local_370._20_4_ = (undefined4)((ulong)uVar198 >> 0x20);
                          local_370._24_4_ = FStack_4e8;
                          uVar198 = vmovlps_avx(auVar126);
                          fStack_354 = (float)uVar198;
                          fStack_350 = (float)((ulong)uVar198 >> 0x20);
                          local_330 = (MediumInterface *)0x0;
                          local_328.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                   )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                     )local_438._0_8_;
                          auVar175._16_16_ = auVar156;
                          auVar175._0_16_ = auVar159;
                          auVar293._16_16_ = auVar255;
                          auVar293._0_16_ = auVar159;
                          auVar177 = vperm2f128_avx(auVar293,auVar175,0x31);
                          auVar266._16_16_ = auVar256;
                          auVar266._0_16_ = auVar276;
                          local_318 = vunpcklpd_avx(auVar266,auVar177);
                          local_2f8._16_16_ = vmovlhps_avx(auVar129,auVar130);
                          local_2f8._0_16_ = _local_598;
                          local_2d8.values.values[1] =
                               (float)((uint)bVar7 * auVar132._4_4_ |
                                      (uint)!bVar7 *
                                      (uint)((byte)(uVar113 >> 1) & 1) * auVar131._4_4_) *
                               (float)local_578._4_4_;
                          local_2d8.values.values[0] =
                               (float)((uint)bVar10 * auVar132._0_4_ |
                                      (uint)!bVar10 * (uint)((byte)uVar113 & 1) * auVar131._0_4_) *
                               (float)local_578._0_4_;
                          local_2d8.values.values[2] =
                               (float)((uint)bVar8 * auVar132._8_4_ |
                                      (uint)!bVar8 *
                                      (uint)((byte)(uVar113 >> 2) & 1) * auVar131._8_4_) *
                               fStack_570;
                          local_2d8.values.values[3] =
                               (float)((uint)bVar9 * auVar132._12_4_ |
                                      (uint)!bVar9 * (uint)(byte)(uVar113 >> 3) * auVar131._12_4_) *
                               fStack_56c;
                          auVar178 = ZEXT1664(auVar309);
                          auVar183 = ZEXT1664(auVar129);
                          fStack_34c = auVar159._0_4_;
                          local_320.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                               (TaggedPointer<pbrt::HGPhaseFunction>)
                               (TaggedPointer<pbrt::HGPhaseFunction>)
                               ((long)puVar121 + 0x74U | 0x1000000000000);
                          bVar123 = SampleLd::anon_class_32_4_3820c045::operator()
                                              (&local_3b8,(MediumSample *)local_370);
                          cVar124 = !bVar123;
                          if ((bool)cVar124) {
                            local_f8._8_4_ = 0x3f800000;
                            local_f8._0_8_ = 0x3f8000003f800000;
                            local_f8._12_4_ = 0x3f800000;
                          }
                          else {
                            local_5f8._0_4_ = local_418._0_4_;
                          }
                          fStack_570 = 1.0;
                          local_578 = (undefined1  [8])0x3f8000003f800000;
                          fStack_56c = 1.0;
                          auVar296 = ZEXT464((uint)local_528._0_4_);
                          lambda = local_3c0;
                        }
                      }
                    } while (cVar124 == '\0');
                    if (cVar124 == '\n') {
                      auVar130 = ZEXT416((uint)local_5f8._0_4_);
                      auVar307 = ZEXT1664(local_2c8);
                      auVar129 = ZEXT416((uint)local_538._0_4_);
                      goto LAB_004006f1;
                    }
                    auVar130 = ZEXT416((uint)local_5f8._0_4_);
                    auVar289 = ZEXT464((uint)local_558._0_4_);
                    auVar307 = ZEXT1664(local_2c8);
                  }
                  else {
                    fVar148 = auVar129._0_4_ - auVar288._0_4_;
                    auVar155._0_4_ = fVar148 * in_ZmmResult._0_4_;
                    auVar155._4_4_ = fVar148 * in_ZmmResult._4_4_;
                    auVar155._8_4_ = fVar148 * in_ZmmResult._8_4_;
                    auVar155._12_4_ = fVar148 * in_ZmmResult._12_4_;
                    auVar13._8_4_ = 0x3fb8aa3b;
                    auVar13._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar13._12_4_ = 0x3fb8aa3b;
                    auVar128 = vmulps_avx512vl(auVar155,auVar13);
                    auVar126 = vroundps_avx(auVar128,9);
                    auVar128 = vsubps_avx(auVar128,auVar126);
                    auVar206._0_4_ = (int)auVar126._0_4_;
                    auVar206._4_4_ = (int)auVar126._4_4_;
                    auVar206._8_4_ = (int)auVar126._8_4_;
                    auVar206._12_4_ = (int)auVar126._12_4_;
                    auVar253._8_4_ = 0x3da00ac9;
                    auVar253._0_8_ = 0x3da00ac93da00ac9;
                    auVar253._12_4_ = 0x3da00ac9;
                    auVar14._8_4_ = 0x3e679a0b;
                    auVar14._0_8_ = 0x3e679a0b3e679a0b;
                    auVar14._12_4_ = 0x3e679a0b;
                    auVar126 = vfmadd213ps_avx512vl(auVar253,auVar128,auVar14);
                    auVar15._8_4_ = 0x3f321004;
                    auVar15._0_8_ = 0x3f3210043f321004;
                    auVar15._12_4_ = 0x3f321004;
                    auVar126 = vfmadd213ps_avx512vl(auVar126,auVar128,auVar15);
                    auVar16._8_4_ = 0x3f800000;
                    auVar16._0_8_ = 0x3f8000003f800000;
                    auVar16._12_4_ = 0x3f800000;
                    auVar128 = vfmadd213ps_avx512vl(auVar126,auVar128,auVar16);
                    auVar156 = vpsrld_avx(auVar128,0x17);
                    auVar273._8_4_ = 0xffffff81;
                    auVar273._0_8_ = 0xffffff81ffffff81;
                    auVar273._12_4_ = 0xffffff81;
                    auVar126 = vpaddd_avx(auVar206,auVar273);
                    auVar126 = vpaddd_avx(auVar126,auVar156);
                    uVar113 = vpcmpgtd_avx512vl(auVar126,auVar273);
                    uVar113 = uVar113 & 0xf;
                    auVar17._8_4_ = 0x7f;
                    auVar17._0_8_ = 0x7f0000007f;
                    auVar17._12_4_ = 0x7f;
                    uVar116 = vpcmpgtd_avx512vl(auVar126,auVar17);
                    uVar116 = uVar116 & 0xf;
                    auVar18._8_4_ = 0x807fffff;
                    auVar18._0_8_ = 0x807fffff807fffff;
                    auVar18._12_4_ = 0x807fffff;
                    auVar128 = vpandd_avx512vl(auVar128,auVar18);
                    auVar126 = vpslld_avx(auVar126,0x17);
                    auVar19._8_4_ = 0x3f800000;
                    auVar19._0_8_ = 0x3f8000003f800000;
                    auVar19._12_4_ = 0x3f800000;
                    auVar126 = vpaddd_avx512vl(auVar126,auVar19);
                    auVar126 = vpord_avx512vl(auVar126,auVar128);
                    auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar123 = (bool)((byte)uVar116 & 1);
                    in_ZmmResult._0_4_ =
                         (float)((uint)bVar123 * auVar128._0_4_ |
                                (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar126._0_4_);
                    bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
                    in_ZmmResult._4_4_ =
                         (float)((uint)bVar123 * auVar128._4_4_ |
                                (uint)!bVar123 * (uint)((byte)(uVar113 >> 1) & 1) * auVar126._4_4_);
                    bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
                    in_ZmmResult._8_4_ =
                         (float)((uint)bVar123 * auVar128._8_4_ |
                                (uint)!bVar123 * (uint)((byte)(uVar113 >> 2) & 1) * auVar126._8_4_);
                    bVar123 = SUB81(uVar116 >> 3,0);
                    in_ZmmResult._12_4_ =
                         (float)((uint)bVar123 * auVar128._12_4_ |
                                (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar126._12_4_);
                    local_578._4_4_ = in_ZmmResult._4_4_ * (float)local_578._4_4_;
                    local_578._0_4_ = in_ZmmResult._0_4_ * (float)local_578._0_4_;
                    fStack_570 = in_ZmmResult._8_4_ * fStack_570;
                    auStack_568 = auVar177._16_16_;
                    fStack_56c = in_ZmmResult._12_4_ * fStack_56c;
LAB_004006f1:
                    auVar289 = ZEXT464((uint)local_558._0_4_);
                    cVar124 = '\b';
                    if ((local_5e4[iVar105] <= (float)local_558._0_4_) &&
                       (iVar112 = local_584[iVar105],
                       local_584[iVar105] = iVar112 + aiStack_4b0[iVar105],
                       iVar112 + aiStack_4b0[iVar105] != aiStack_394[iVar105])) {
                      local_5e4[iVar105] = local_5e4[iVar105] + afStack_4a4[iVar105];
                      cVar124 = '\0';
                      auVar130 = auVar129;
                    }
                  }
                  auVar288 = ZEXT1664(auVar130);
                } while (cVar124 == '\0');
                auVar135 = local_f8;
                if (cVar124 == '\b') {
                  auVar135 = _local_578;
                }
              }
              auVar129 = vshufpd_avx(auVar135,auVar135,1);
              local_f8 = auVar135;
              goto LAB_00402265;
            }
            local_5d8 = (undefined1  [8])&local_468;
            uStack_5d0 = &local_4c8;
            uStack_5c8 = &local_428;
            pRStack_5c0 = &local_518;
            auVar150._0_4_ = IStack_250.high * IStack_250.high;
            auVar150._4_4_ = fStack_248 * fStack_248;
            auVar150._8_8_ = 0;
            auVar126 = vhaddps_avx(auVar150,auVar150);
            fVar194 = (float)uStack_244 * (float)uStack_244 + auVar126._0_4_;
            local_458._0_4_ = IStack_250.low;
            _local_578 = ZEXT416((uint)fVar148);
            local_4d8 = auVar132;
            local_478 = auVar297;
            _local_448 = auVar131;
            if (fVar194 < 0.0) {
              local_598._0_4_ = fVar194;
              fVar148 = sqrtf(fVar194);
              fVar194 = (float)local_598._0_4_;
            }
            else {
              auVar126 = vsqrtss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194));
              fVar148 = auVar126._0_4_;
            }
            uVar113 = 0;
            local_5f8._0_4_ = fVar148;
            if (fVar194 < 0.0) {
              uVar113 = 0;
              auVar184._0_4_ = sqrtf(fVar194);
              auVar184._4_60_ = extraout_var_01;
              _local_418 = auVar184._0_16_;
            }
            else {
              _local_418 = vsqrtss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194));
            }
            this_00 = (DenselySampledSpectrum *)(local_438._0_8_ & 0xffffffffffff);
            _local_598 = ZEXT416((uint)this_00[3].lambda_min);
            uVar198 = 0;
            auVar248 = ZEXT856(uVar113);
            auVar178 = ZEXT1664(auVar129);
            auVar183 = ZEXT1664(auVar130);
            SVar323 = DenselySampledSpectrum::Sample(this_00,lambda);
            auVar233._0_8_ = SVar323.values.values._8_8_;
            auVar233._8_56_ = auVar248;
            uStack_530 = uVar198;
            local_538 = (undefined1  [8])SVar323.values.values._0_8_;
            _local_548 = auVar233._0_16_;
            auVar197 = (undefined1  [56])0x0;
            _local_558 = ZEXT416((uint)this_00[3].lambda_min);
            SVar323 = DenselySampledSpectrum::Sample(this_00 + 1,lambda);
            auVar234._0_8_ = SVar323.values.values._8_8_;
            auVar234._8_56_ = auVar248;
            auVar185._0_8_ = SVar323.values.values._0_8_;
            auVar185._8_56_ = auVar197;
            auVar129 = vunpcklpd_avx(_local_538,_local_548);
            fVar250 = (float)local_598._0_4_ * auVar129._0_4_;
            fVar270 = (float)local_598._0_4_ * auVar129._4_4_;
            fVar271 = (float)local_598._0_4_ * auVar129._8_4_;
            fVar272 = (float)local_598._0_4_ * auVar129._12_4_;
            auVar129 = vmovlhps_avx(auVar185._0_16_,auVar234._0_16_);
            fVar148 = (float)local_558._0_4_ * auVar129._0_4_;
            fVar194 = (float)local_558._0_4_ * auVar129._4_4_;
            fVar195 = (float)local_558._0_4_ * auVar129._8_4_;
            fVar308 = (float)local_558._0_4_ * auVar129._12_4_;
            fVar149 = fVar148 + fVar250;
            fVar246 = fVar194 + fVar270;
            fVar247 = fVar195 + fVar271;
            fVar249 = fVar308 + fVar272;
            bVar123 = ABS((float)local_5f8._0_4_ * (float)local_578._0_4_) == INFINITY;
            uVar106 = (uint)bVar123 * 0x7f7fffff +
                      (uint)!bVar123 * (int)((float)local_5f8._0_4_ * (float)local_578._0_4_);
            if ((fVar149 != 0.0) || (NAN(fVar149))) {
              local_538._4_4_ = fVar194;
              local_538._0_4_ = fVar148;
              uStack_530._0_4_ = fVar195;
              uStack_530._4_4_ = fVar308;
              local_598._4_4_ = fVar270;
              local_598._0_4_ = fVar250;
              uStack_590._0_4_ = fVar271;
              uStack_590._4_4_ = fVar272;
              _local_578 = ZEXT1632(CONCAT412(fVar249,CONCAT48(fVar247,CONCAT44(fVar246,fVar149))));
              _local_5f8 = ZEXT416(uVar106);
              auVar178 = ZEXT1664(auVar178._0_16_);
              auVar183 = ZEXT1664(auVar183._0_16_);
              fVar148 = logf(1.0 - (float)local_528._0_4_);
              fVar148 = -fVar148 / (float)local_578._0_4_;
              if ((float)local_5f8._0_4_ <= fVar148) {
                auVar152._0_4_ = (float)local_578._0_4_ * -(float)local_5f8._0_4_;
                auVar152._4_4_ = (float)local_578._4_4_ * -(float)local_5f8._0_4_;
                auVar152._8_4_ = fStack_570 * -(float)local_5f8._0_4_;
                auVar152._12_4_ = fStack_56c * -(float)local_5f8._0_4_;
                goto LAB_00402550;
              }
              local_5f8 = (undefined1  [8])
                          (CONCAT44(extraout_var._0_4_,fVar148) ^ 0x8000000000000000);
              fStack_5f0 = (float)(extraout_var._4_4_ ^ 0x80000000);
              fStack_5ec = (float)(extraout_var._8_4_ ^ 0x80000000);
              auVar172._0_4_ = (float)local_578._0_4_ * -fVar148;
              auVar172._4_4_ = (float)local_578._4_4_ * -fVar148;
              auVar172._8_4_ = fStack_570 * -fVar148;
              auVar172._12_4_ = fStack_56c * -fVar148;
              auVar42._8_4_ = 0x3fb8aa3b;
              auVar42._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar42._12_4_ = 0x3fb8aa3b;
              auVar129 = vmulps_avx512vl(auVar172,auVar42);
              _local_558 = vroundps_avx(auVar129,9);
              auVar129 = vsubps_avx(auVar129,_local_558);
              auVar227._8_4_ = 0x3da00ac9;
              auVar227._0_8_ = 0x3da00ac93da00ac9;
              auVar227._12_4_ = 0x3da00ac9;
              auVar43._8_4_ = 0x3e679a0b;
              auVar43._0_8_ = 0x3e679a0b3e679a0b;
              auVar43._12_4_ = 0x3e679a0b;
              auVar130 = vfmadd213ps_avx512vl(auVar227,auVar129,auVar43);
              auVar44._8_4_ = 0x3f321004;
              auVar44._0_8_ = 0x3f3210043f321004;
              auVar44._12_4_ = 0x3f321004;
              auVar130 = vfmadd213ps_avx512vl(auVar130,auVar129,auVar44);
              auVar45._8_4_ = 0x3f800000;
              auVar45._0_8_ = 0x3f8000003f800000;
              auVar45._12_4_ = 0x3f800000;
              _local_548 = vfmadd213ps_avx512vl(auVar130,auVar129,auVar45);
              local_528 = ZEXT416((uint)this_00[3].lambda_max);
              auVar197 = ZEXT856(0);
              auVar248 = ZEXT856(local_548._8_8_);
              SVar323 = DenselySampledSpectrum::Sample(this_00 + 2,lambda);
              auVar245._0_8_ = SVar323.values.values._8_8_;
              auVar245._8_56_ = auVar248;
              auVar193._0_8_ = SVar323.values.values._0_8_;
              auVar193._8_56_ = auVar197;
              auVar128 = vshufpd_avx(_local_598,_local_598,1);
              auVar285._4_4_ = local_418._0_4_;
              auVar285._0_4_ = local_418._0_4_;
              auVar285._8_4_ = local_418._0_4_;
              auVar285._12_4_ = local_418._0_4_;
              auVar129 = vdivps_avx(local_478,auVar285);
              fStack_34c = local_448._0_4_ / (float)local_418._0_4_;
              auVar255 = local_578._0_16_;
              auVar156 = vshufpd_avx(auVar255,auVar255,1);
              auVar301._0_4_ = (int)(float)local_558._0_4_;
              auVar301._4_4_ = (int)(float)local_558._4_4_;
              auVar301._8_4_ = (int)fStack_550;
              auVar301._12_4_ = (int)fStack_54c;
              auVar126 = vpsrld_avx(_local_548,0x17);
              auVar312._8_4_ = 0xffffff81;
              auVar312._0_8_ = 0xffffff81ffffff81;
              auVar312._12_4_ = 0xffffff81;
              auVar130 = vpaddd_avx(auVar312,auVar301);
              auVar130 = vpaddd_avx(auVar130,auVar126);
              uVar113 = vpcmpgtd_avx512vl(auVar130,auVar312);
              uVar113 = uVar113 & 0xf;
              auVar46._8_4_ = 0x7f;
              auVar46._0_8_ = 0x7f0000007f;
              auVar46._12_4_ = 0x7f;
              uVar116 = vpcmpgtd_avx512vl(auVar130,auVar46);
              uVar116 = uVar116 & 0xf;
              auVar47._8_4_ = 0x807fffff;
              auVar47._0_8_ = 0x807fffff807fffff;
              auVar47._12_4_ = 0x807fffff;
              auVar126 = vpandd_avx512vl(_local_548,auVar47);
              auVar130 = vpslld_avx(auVar130,0x17);
              auVar48._8_4_ = 0x3f800000;
              auVar48._0_8_ = 0x3f8000003f800000;
              auVar48._12_4_ = 0x3f800000;
              auVar130 = vpaddd_avx512vl(auVar130,auVar48);
              auVar130 = vpord_avx512vl(auVar130,auVar126);
              auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar123 = (bool)((byte)uVar116 & 1);
              local_2d8.values.values[0] =
                   (float)((uint)bVar123 * auVar126._0_4_ |
                          (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar130._0_4_);
              bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
              local_2d8.values.values[1] =
                   (float)((uint)bVar123 * auVar126._4_4_ |
                          (uint)!bVar123 * (uint)((byte)(uVar113 >> 1) & 1) * auVar130._4_4_);
              bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
              local_2d8.values.values[2] =
                   (float)((uint)bVar123 * auVar126._8_4_ |
                          (uint)!bVar123 * (uint)((byte)(uVar113 >> 2) & 1) * auVar130._8_4_);
              bVar123 = SUB81(uVar116 >> 3,0);
              local_2d8.values.values[3] =
                   (float)((uint)bVar123 * auVar126._12_4_ |
                          (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar130._12_4_);
              in_ZmmResult._0_4_ = local_2d8.values.values[0];
              in_ZmmResult._4_4_ = local_2d8.values.values[1];
              in_ZmmResult._8_4_ = local_2d8.values.values[2];
              in_ZmmResult._12_4_ = local_2d8.values.values[3];
              auVar130 = vmovlhps_avx(auVar193._0_16_,auVar245._0_16_);
              auVar173._0_4_ = (float)local_528._0_4_ * auVar130._0_4_;
              auVar173._4_4_ = (float)local_528._0_4_ * auVar130._4_4_;
              auVar173._8_4_ = (float)local_528._0_4_ * auVar130._8_4_;
              auVar173._12_4_ = (float)local_528._0_4_ * auVar130._12_4_;
              auVar130 = vmovshdup_avx(auVar129);
              fVar148 = local_4d8._0_4_ + (float)local_5f8._0_4_ * auVar129._0_4_;
              auVar126 = vmovshdup_avx(local_4d8);
              fVar194 = auVar126._0_4_ + (float)local_5f8._0_4_ * auVar130._0_4_;
              fVar195 = (float)local_5f8._0_4_ * fStack_34c + (float)local_458._0_4_;
              auVar286._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
              auVar286._8_4_ = auVar129._8_4_ ^ 0x80000000;
              auVar286._12_4_ = auVar129._12_4_ ^ 0x80000000;
              fStack_34c = -fStack_34c;
              local_328.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )&this_00[0x66666666666].values.ptr;
              local_320.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                   (TaggedPointer<pbrt::HGPhaseFunction>)
                   ((ulong)&this_00[3].values | 0x1000000000000);
              auVar228._4_4_ = fVar148;
              auVar228._0_4_ = fVar148;
              auVar228._8_4_ = fVar148;
              auVar228._12_4_ = fVar148;
              auVar305._4_4_ = fVar194;
              auVar305._0_4_ = fVar194;
              auVar305._8_4_ = fVar194;
              auVar305._12_4_ = fVar194;
              auVar129 = vmovlhps_avx(auVar228,auVar305);
              auVar306._4_4_ = fVar195;
              auVar306._0_4_ = fVar195;
              auVar306._8_4_ = fVar195;
              auVar306._12_4_ = fVar195;
              local_348._0_12_ = ZEXT812(0);
              local_348._12_4_ = 0;
              local_338 = 0.0;
              local_370._0_8_ = auVar129._0_8_;
              local_370._8_4_ = auVar129._8_4_;
              local_370._12_4_ = auVar129._12_4_;
              uVar198 = vmovlps_avx(auVar306);
              local_370._16_4_ = (undefined4)uVar198;
              local_370._20_4_ = (undefined4)((ulong)uVar198 >> 0x20);
              local_370._24_4_ = vextractps_avx(_local_448,1);
              uVar198 = vmovlps_avx(auVar286);
              fStack_354 = (float)uVar198;
              fStack_350 = (float)((ulong)uVar198 >> 0x20);
              local_330 = (MediumInterface *)0x0;
              local_318._0_16_ = vunpcklpd_avx(_local_598,auVar128);
              local_318._16_16_ = _local_538;
              auVar231._16_16_ = auVar173;
              auVar231._0_16_ = auVar255;
              auVar269._16_16_ = auVar156;
              auVar269._0_16_ = auVar173;
              auVar177 = vperm2f128_avx(auVar269,ZEXT1632(auVar173),0x21);
              local_2f8 = vshufpd_avx(auVar231,auVar177,8);
              auVar178 = ZEXT1664(local_348);
              auVar183 = ZEXT1664(_local_598);
              SampleLd::anon_class_32_4_3820c045::operator()
                        ((anon_class_32_4_3820c045 *)local_5d8,(MediumSample *)local_370);
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              IVar100 = IStack_250;
            }
            else {
              auVar151._4_4_ = uVar106;
              auVar151._0_4_ = uVar106;
              auVar151._8_4_ = uVar106;
              auVar151._12_4_ = uVar106;
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar129 = vxorps_avx512vl(auVar151,auVar34);
              auVar152._0_4_ = fVar149 * auVar129._0_4_;
              auVar152._4_4_ = fVar246 * auVar129._4_4_;
              auVar152._8_4_ = fVar247 * auVar129._8_4_;
              auVar152._12_4_ = fVar249 * auVar129._12_4_;
LAB_00402550:
              auVar35._8_4_ = 0x3fb8aa3b;
              auVar35._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar35._12_4_ = 0x3fb8aa3b;
              auVar130 = vmulps_avx512vl(auVar152,auVar35);
              auVar129 = vroundps_avx(auVar130,9);
              auVar130 = vsubps_avx(auVar130,auVar129);
              auVar229._0_4_ = (int)auVar129._0_4_;
              auVar229._4_4_ = (int)auVar129._4_4_;
              auVar229._8_4_ = (int)auVar129._8_4_;
              auVar229._12_4_ = (int)auVar129._12_4_;
              auVar265._8_4_ = 0x3da00ac9;
              auVar265._0_8_ = 0x3da00ac93da00ac9;
              auVar265._12_4_ = 0x3da00ac9;
              auVar36._8_4_ = 0x3e679a0b;
              auVar36._0_8_ = 0x3e679a0b3e679a0b;
              auVar36._12_4_ = 0x3e679a0b;
              auVar129 = vfmadd213ps_avx512vl(auVar265,auVar130,auVar36);
              auVar37._8_4_ = 0x3f321004;
              auVar37._0_8_ = 0x3f3210043f321004;
              auVar37._12_4_ = 0x3f321004;
              auVar129 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar37);
              auVar38._8_4_ = 0x3f800000;
              auVar38._0_8_ = 0x3f8000003f800000;
              auVar38._12_4_ = 0x3f800000;
              auVar130 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar38);
              auVar126 = vpsrld_avx(auVar130,0x17);
              auVar287._8_4_ = 0xffffff81;
              auVar287._0_8_ = 0xffffff81ffffff81;
              auVar287._12_4_ = 0xffffff81;
              auVar129 = vpaddd_avx(auVar229,auVar287);
              auVar129 = vpaddd_avx(auVar129,auVar126);
              uVar113 = vpcmpgtd_avx512vl(auVar129,auVar287);
              uVar113 = uVar113 & 0xf;
              auVar39._8_4_ = 0x7f;
              auVar39._0_8_ = 0x7f0000007f;
              auVar39._12_4_ = 0x7f;
              uVar116 = vpcmpgtd_avx512vl(auVar129,auVar39);
              uVar116 = uVar116 & 0xf;
              auVar40._8_4_ = 0x807fffff;
              auVar40._0_8_ = 0x807fffff807fffff;
              auVar40._12_4_ = 0x807fffff;
              auVar130 = vpandd_avx512vl(auVar130,auVar40);
              auVar129 = vpslld_avx(auVar129,0x17);
              auVar41._8_4_ = 0x3f800000;
              auVar41._0_8_ = 0x3f8000003f800000;
              auVar41._12_4_ = 0x3f800000;
              auVar129 = vpaddd_avx512vl(auVar129,auVar41);
              auVar129 = vpord_avx512vl(auVar129,auVar130);
              auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar123 = (bool)((byte)uVar116 & 1);
              auVar135._0_4_ =
                   (uint)bVar123 * auVar130._0_4_ |
                   (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar129._0_4_;
              bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
              auVar135._4_4_ =
                   (uint)bVar123 * auVar130._4_4_ |
                   (uint)!bVar123 * (uint)((byte)(uVar113 >> 1) & 1) * auVar129._4_4_;
              bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
              auVar135._8_4_ =
                   (uint)bVar123 * auVar130._8_4_ |
                   (uint)!bVar123 * (uint)((byte)(uVar113 >> 2) & 1) * auVar129._8_4_;
              bVar123 = SUB81(uVar116 >> 3,0);
              auVar135._12_4_ =
                   (uint)bVar123 * auVar130._12_4_ |
                   (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar129._12_4_;
              in_ZmmResult._0_16_ = auVar135;
              IVar100 = IStack_250;
            }
            auVar129 = vshufpd_avx(auVar135,auVar135,1);
          }
          else {
            puVar121 = (undefined8 *)(local_238.bits & 0xffffffffffff);
            _local_4f4 = vmovlhps_avx(auVar297,auVar131);
            if (sVar95 == 3) {
              local_500 = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar132);
              local_4f8 = IStack_250.low;
              local_4e0.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                         )local_238.bits;
              local_3b8.T_ray = &local_468;
              local_3b8.lightPathPDF = &local_4c8;
              local_3b8.uniPathPDF = &local_428;
              local_3b8.rng = &local_518;
              local_5b0._0_4_ = fVar148;
              auVar178 = ZEXT1664(auVar129);
              auVar183 = ZEXT1664(auVar130);
              Transform::ApplyInverse
                        ((Ray *)local_5d8,(Transform *)(puVar121 + 0xf),(Ray *)&local_500,
                         (Float *)&local_5b0);
              auVar200._0_4_ = (float)uStack_5c8 * (float)uStack_5c8;
              auVar200._4_4_ = uStack_5c8._4_4_ * uStack_5c8._4_4_;
              auVar200._8_8_ = 0;
              auVar129 = vmovshdup_avx(auVar200);
              fVar148 = uStack_5d0._4_4_ * uStack_5d0._4_4_ + auVar200._0_4_ + auVar129._0_4_;
              if (fVar148 < 0.0) {
                fVar148 = sqrtf(fVar148);
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              else {
                auVar129 = vsqrtss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                fVar148 = auVar129._0_4_;
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              uStack_5c8._4_4_ = (float)((ulong)pSVar99 >> 0x20);
              uStack_5c8._0_4_ = SUB84(pSVar99,0);
              uStack_5d0._4_4_ = (float)((ulong)pSVar98 >> 0x20);
              local_5b0._0_4_ = fVar148 * (float)local_5b0;
              auVar202._0_4_ = (float)uStack_5c8 * (float)uStack_5c8;
              auVar202._4_4_ = uStack_5c8._4_4_ * uStack_5c8._4_4_;
              auVar202._8_8_ = 0;
              auVar129 = vmovshdup_avx(auVar202);
              fVar148 = uStack_5d0._4_4_ * uStack_5d0._4_4_ + auVar202._0_4_ + auVar129._0_4_;
              if (fVar148 < 0.0) {
                uStack_5d0 = pSVar98;
                uStack_5c8 = pSVar99;
                fVar148 = sqrtf(fVar148);
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              else {
                auVar129 = vsqrtss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                fVar148 = auVar129._0_4_;
              }
              uStack_5c8._4_4_ = (float)((ulong)pSVar99 >> 0x20);
              uStack_5c8._0_4_ = SUB84(pSVar99,0);
              uStack_5d0._4_4_ = (float)((ulong)pSVar98 >> 0x20);
              uStack_5d0._0_4_ = SUB84(pSVar98,0);
              auVar212._4_4_ = (float)uStack_5c8;
              auVar212._0_4_ = uStack_5d0._4_4_;
              auVar212._8_8_ = 0;
              auVar257._4_4_ = fVar148;
              auVar257._0_4_ = fVar148;
              auVar257._8_4_ = fVar148;
              auVar257._12_4_ = fVar148;
              auVar129 = vdivps_avx(auVar212,auVar257);
              uVar198 = vmovlps_avx(auVar129);
              uStack_5d0._4_4_ = (float)uVar198;
              uStack_5c8._0_4_ = (float)((ulong)uVar198 >> 0x20);
              uStack_5c8._4_4_ = uStack_5c8._4_4_ / fVar148;
              auVar288 = ZEXT464((uint)(float)local_5b0);
              auVar129 = ZEXT816(0) << 0x40;
              bVar123 = false;
              uVar106 = 0;
              do {
                pfVar122 = (float *)((long)&uStack_5d0 + 4);
                if ((uVar106 != 0) && (pfVar122 = (float *)&uStack_5c8, uVar106 != 1)) {
                  pfVar122 = (float *)((long)&uStack_5c8 + 4);
                }
                pfVar114 = (float *)(puVar121 + 1);
                if ((uVar106 != 0) && (pfVar114 = (float *)((long)puVar121 + 0xc), uVar106 != 1)) {
                  pfVar114 = (float *)(puVar121 + 2);
                }
                pRVar118 = (Ray *)local_5d8;
                if ((uVar106 != 0) && (pRVar118 = (Ray *)(local_5d8 + 4), uVar106 != 1)) {
                  pRVar118 = (Ray *)&uStack_5d0;
                }
                pfVar119 = (float *)((long)puVar121 + 0x14);
                if ((uVar106 != 0) && (pfVar119 = (float *)(puVar121 + 3), uVar106 != 1)) {
                  pfVar119 = (float *)((long)puVar121 + 0x1c);
                }
                pRVar120 = (Ray *)local_5d8;
                if ((uVar106 != 0) && (pRVar120 = (Ray *)(local_5d8 + 4), uVar106 != 1)) {
                  pRVar120 = (Ray *)&uStack_5d0;
                }
                auVar197 = (undefined1  [56])0x0;
                auVar126 = ZEXT416((uint)((1.0 / *pfVar122) *
                                         (*pfVar119 -
                                         (pRVar120->o).super_Tuple3<pbrt::Point3,_float>.x)));
                auVar128 = ZEXT416((uint)((1.0 / *pfVar122) *
                                         (*pfVar114 -
                                         (pRVar118->o).super_Tuple3<pbrt::Point3,_float>.x)));
                auVar130 = vminss_avx(auVar126,auVar128);
                auVar129 = vmaxss_avx(auVar130,auVar129);
                auVar130 = vmaxss_avx(auVar128,auVar126);
                auVar130 = vminss_avx(ZEXT416((uint)(auVar130._0_4_ * 1.0000004)),auVar288._0_16_);
                auVar288 = ZEXT1664(auVar130);
                if (auVar130._0_4_ < auVar129._0_4_) break;
                bVar123 = 1 < uVar106;
                uVar106 = uVar106 + 1;
              } while (uVar106 != 3);
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              if (bVar123) {
                _local_578 = auVar129;
                local_558._0_4_ = auVar130._0_4_;
                uVar198 = 0;
                _local_5f8 = ZEXT416(*(uint *)(puVar121 + 0xe));
                SVar323 = DenselySampledSpectrum::Sample
                                    ((DenselySampledSpectrum *)(puVar121 + 4),lambda);
                auVar238._0_8_ = SVar323.values.values._8_8_;
                auVar238._8_56_ = auVar197;
                uStack_590 = uVar198;
                local_598 = (undefined1  [8])SVar323.values.values._0_8_;
                _local_538 = auVar238._0_16_;
                auVar248 = (undefined1  [56])0x0;
                _local_548 = ZEXT416(*(uint *)(puVar121 + 0xe));
                SVar323 = DenselySampledSpectrum::Sample
                                    ((DenselySampledSpectrum *)(puVar121 + 9),lambda);
                auVar239._0_8_ = SVar323.values.values._8_8_;
                auVar239._8_56_ = auVar197;
                auVar188._0_8_ = SVar323.values.values._0_8_;
                auVar188._8_56_ = auVar248;
                auVar129 = vunpcklpd_avx(_local_598,_local_538);
                local_268 = (float)local_5f8._0_4_ * auVar129._0_4_;
                fStack_264 = (float)local_5f8._0_4_ * auVar129._4_4_;
                fStack_260 = (float)local_5f8._0_4_ * auVar129._8_4_;
                fStack_25c = (float)local_5f8._0_4_ * auVar129._12_4_;
                auVar129 = vmovlhps_avx(auVar188._0_16_,auVar239._0_16_);
                fVar148 = (float)local_548._0_4_ * auVar129._0_4_;
                fVar194 = (float)local_548._0_4_ * auVar129._4_4_;
                fStack_270 = (float)local_548._0_4_ * auVar129._8_4_;
                fStack_26c = (float)local_548._0_4_ * auVar129._12_4_;
                local_278 = CONCAT44(fVar194,fVar148);
                local_388._0_4_ = fVar148 + local_268;
                local_388._4_4_ = fVar194 + fStack_264;
                local_388._8_4_ = fStack_270 + fStack_260;
                local_388._12_4_ = fStack_26c + fStack_25c;
                auVar288 = ZEXT1664(local_388);
                fVar148 = *(float *)(puVar121 + 2);
                fVar308 = *(float *)((long)puVar121 + 0x1c) - fVar148;
                uVar198 = vcmpss_avx512f(ZEXT416((uint)fVar148),
                                         ZEXT416((uint)*(float *)((long)puVar121 + 0x1c)),1);
                bVar10 = (bool)((byte)uVar198 & 1);
                auVar160._8_8_ = 0;
                auVar160._0_8_ = puVar121[1];
                auVar213._8_8_ = 0;
                auVar213._0_8_ = *(ulong *)((long)puVar121 + 0x14);
                auVar129 = vsubps_avx(auVar213,auVar160);
                auVar299._8_8_ = 0;
                auVar299._0_8_ = local_5d8;
                auVar130 = vsubps_avx(auVar299,auVar160);
                uVar113 = vcmpps_avx512vl(auVar160,auVar213,1);
                auVar126 = vdivps_avx512vl(auVar130,auVar129);
                bVar123 = (bool)((byte)uVar113 & 1);
                auVar133._0_4_ =
                     (float)((uint)bVar123 * auVar126._0_4_ | (uint)!bVar123 * auVar130._0_4_);
                bVar123 = (bool)((byte)(uVar113 >> 1) & 1);
                auVar133._4_4_ = (uint)bVar123 * auVar126._4_4_ | (uint)!bVar123 * auVar130._4_4_;
                bVar123 = (bool)((byte)(uVar113 >> 2) & 1);
                auVar133._8_4_ = (uint)bVar123 * auVar126._8_4_ | (uint)!bVar123 * auVar130._8_4_;
                bVar123 = (bool)((byte)(uVar113 >> 3) & 1);
                auVar133._12_4_ = (uint)bVar123 * auVar126._12_4_ | (uint)!bVar123 * auVar130._12_4_
                ;
                in_ZmmResult._0_16_ = auVar133;
                auVar130 = vmovshdup_avx(auVar133);
                auVar161._4_4_ = (float)uStack_5c8;
                auVar161._0_4_ = uStack_5d0._4_4_;
                auVar161._8_8_ = 0;
                auVar129 = vdivps_avx(auVar161,auVar129);
                local_5fc = uStack_5c8._4_4_ / fVar308;
                uVar198 = vmovlps_avx(auVar129);
                local_5a8.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar198;
                local_5a8.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar198 >> 0x20);
                fVar149 = local_578._0_4_;
                fVar194 = fVar149 * local_5a8.super_Tuple3<pbrt::Point3,_float>.x + auVar133._0_4_;
                fVar195 = fVar149 * local_5a8.super_Tuple3<pbrt::Point3,_float>.y + auVar130._0_4_;
                fVar148 = (float)((uint)bVar10 * (int)(((float)uStack_5d0 - fVar148) / fVar308) +
                                 (uint)!bVar10 * (int)((float)uStack_5d0 - fVar148)) +
                          fVar149 * local_5fc;
                piVar1 = (int *)(puVar121 + 0x23);
                piVar2 = (int *)((long)puVar121 + 0x11c);
                piVar3 = (int *)(puVar121 + 0x24);
                lVar111 = 0;
                pfVar122 = &local_5a8.super_Tuple3<pbrt::Point3,_float>.y;
                do {
                  iVar105 = (int)lVar111;
                  fVar308 = fVar194;
                  if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                    fVar308 = fVar148;
                  }
                  piVar115 = piVar1;
                  if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                    piVar115 = piVar3;
                  }
                  piVar117 = piVar1;
                  if ((iVar105 != 0) && (piVar117 = piVar2, iVar105 != 1)) {
                    piVar117 = piVar3;
                  }
                  auVar291._0_4_ = (float)(*piVar117 + -1);
                  auVar291._4_12_ = auVar178._4_12_;
                  auVar129 = vminss_avx(auVar291,ZEXT416((uint)(fVar308 * (float)*piVar115)));
                  uVar198 = vcmpss_avx512f(ZEXT416((uint)(fVar308 * (float)*piVar115)),
                                           ZEXT816(0) << 0x40,1);
                  auVar140._16_48_ = in_ZmmResult._16_48_;
                  auVar140._0_16_ = auVar129;
                  fVar308 = (float)((uint)!(bool)((byte)uVar198 & 1) * auVar129._0_4_);
                  in_ZmmResult._4_60_ = auVar140._4_60_;
                  in_ZmmResult._0_4_ = fVar308;
                  iVar112 = (int)fVar308;
                  local_584[lVar111] = iVar112;
                  pfVar114 = (float *)&local_5a8;
                  if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                    pfVar114 = &local_5fc;
                  }
                  if ((*pfVar114 == 0.0) && (!NAN(*pfVar114))) {
                    pfVar114 = (float *)&local_5a8;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_5fc;
                    }
                    *pfVar114 = 0.0;
                  }
                  pfVar114 = (float *)&local_5a8;
                  if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                    pfVar114 = &local_5fc;
                  }
                  if (0.0 <= *pfVar114) {
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    fVar308 = fVar194;
                    if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                      fVar308 = fVar148;
                    }
                    pfVar114 = (float *)&local_5a8;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_5fc;
                    }
                    local_5e4[lVar111] =
                         fVar149 + ((float)(iVar112 + 1) / (float)*piVar115 - fVar308) / *pfVar114;
                    pfVar114 = (float *)&local_5a8;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_5fc;
                    }
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    afStack_4a4[lVar111] = 1.0 / ((float)*piVar115 * *pfVar114);
                    aiStack_4b0[lVar111] = 1;
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    iVar105 = *piVar115;
                  }
                  else {
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    fVar308 = fVar194;
                    if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                      fVar308 = fVar148;
                    }
                    pfVar114 = (float *)&local_5a8;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_5fc;
                    }
                    local_5e4[lVar111] =
                         fVar149 + ((float)iVar112 / (float)*piVar115 - fVar308) / *pfVar114;
                    pfVar114 = (float *)&local_5a8;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_5fc;
                    }
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    afStack_4a4[lVar111] = -1.0 / ((float)*piVar115 * *pfVar114);
                    aiStack_4b0[lVar111] = -1;
                    iVar105 = -1;
                  }
                  aiStack_394[lVar111] = iVar105;
                  lVar111 = lVar111 + 1;
                } while (lVar111 != 3);
                fStack_5f0 = 1.0;
                local_5f8 = (undefined1  [8])0x3f8000003f800000;
                fStack_5ec = 1.0;
                auVar289 = ZEXT464((uint)local_528._0_4_);
                auVar307 = ZEXT464((uint)local_558._0_4_);
                auVar129 = _local_578;
                do {
                  iVar105 = *(int *)(&DAT_005841e0 +
                                    (ulong)((uint)(local_5e4[1] < local_5e4[2]) |
                                           (uint)(local_5e4[0] < local_5e4[1]) * 4 +
                                           (uint)(local_5e4[0] < local_5e4[2]) * 2) * 4);
                  uVar4 = *(undefined4 *)
                           (puVar121[0x20] +
                           (((long)local_584[2] * (long)*(int *)((long)puVar121 + 0x11c) +
                            (long)local_584[1]) * (long)*(int *)(puVar121 + 0x23) +
                           (long)local_584[0]) * 4);
                  auVar49._4_4_ = uVar4;
                  auVar49._0_4_ = uVar4;
                  auVar49._8_4_ = uVar4;
                  auVar49._12_4_ = uVar4;
                  auVar126 = vmulps_avx512vl(auVar288._0_16_,auVar49);
                  auVar130 = vminss_avx(ZEXT416((uint)local_5e4[iVar105]),auVar307._0_16_);
                  auVar50._8_4_ = 0x80000000;
                  auVar50._0_8_ = 0x8000000080000000;
                  auVar50._12_4_ = 0x80000000;
                  in_ZmmResult._0_16_ = vxorps_avx512vl(auVar126,auVar50);
                  if ((auVar126._0_4_ != 0.0) || (NAN(auVar126._0_4_))) {
                    local_538._0_4_ = auVar130._0_4_;
                    _local_578 = auVar129;
                    _local_598 = auVar126;
                    _local_548 = in_ZmmResult._0_16_;
                    do {
                      fVar148 = logf(1.0 - auVar289._0_4_);
                      uVar102 = local_518.state;
                      fVar148 = (float)local_578._0_4_ - fVar148 / (float)local_598._0_4_;
                      local_518.state = local_518.state * 0x5851f42d4c957f2d + local_518.inc;
                      uVar106 = (uint)(uVar102 >> 0x2d) ^ (uint)(uVar102 >> 0x1b);
                      bVar109 = (byte)(uVar102 >> 0x3b);
                      auVar130 = auVar183._0_16_;
                      auVar129 = vcvtusi2ss_avx512f(auVar130,uVar106 >> bVar109 |
                                                             uVar106 << 0x20 - bVar109);
                      auVar129 = vminss_avx(ZEXT416((uint)(auVar129._0_4_ * 2.3283064e-10)),
                                            ZEXT416(0x3f7fffff));
                      auVar289 = ZEXT1664(auVar129);
                      if ((float)local_538._0_4_ <= fVar148) {
                        fVar148 = (float)local_538._0_4_ - (float)local_578._0_4_;
                        auVar164._0_4_ = fVar148 * (float)local_548._0_4_;
                        auVar164._4_4_ = fVar148 * (float)local_548._4_4_;
                        auVar164._8_4_ = fVar148 * fStack_540;
                        auVar164._12_4_ = fVar148 * fStack_53c;
                        auVar65._8_4_ = 0x3fb8aa3b;
                        auVar65._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar65._12_4_ = 0x3fb8aa3b;
                        auVar130 = vmulps_avx512vl(auVar164,auVar65);
                        auVar129 = vroundps_avx(auVar130,9);
                        auVar130 = vsubps_avx(auVar130,auVar129);
                        auVar217._0_4_ = (int)auVar129._0_4_;
                        auVar217._4_4_ = (int)auVar129._4_4_;
                        auVar217._8_4_ = (int)auVar129._8_4_;
                        auVar217._12_4_ = (int)auVar129._12_4_;
                        auVar259._8_4_ = 0x3da00ac9;
                        auVar259._0_8_ = 0x3da00ac93da00ac9;
                        auVar259._12_4_ = 0x3da00ac9;
                        auVar66._8_4_ = 0x3e679a0b;
                        auVar66._0_8_ = 0x3e679a0b3e679a0b;
                        auVar66._12_4_ = 0x3e679a0b;
                        auVar129 = vfmadd213ps_avx512vl(auVar259,auVar130,auVar66);
                        auVar67._8_4_ = 0x3f321004;
                        auVar67._0_8_ = 0x3f3210043f321004;
                        auVar67._12_4_ = 0x3f321004;
                        auVar129 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar67);
                        auVar68._8_4_ = 0x3f800000;
                        auVar68._0_8_ = 0x3f8000003f800000;
                        auVar68._12_4_ = 0x3f800000;
                        auVar130 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar68);
                        auVar126 = vpsrld_avx(auVar130,0x17);
                        auVar278._8_4_ = 0xffffff81;
                        auVar278._0_8_ = 0xffffff81ffffff81;
                        auVar278._12_4_ = 0xffffff81;
                        auVar129 = vpaddd_avx(auVar217,auVar278);
                        auVar129 = vpaddd_avx(auVar129,auVar126);
                        uVar113 = vpcmpgtd_avx512vl(auVar129,auVar278);
                        uVar113 = uVar113 & 0xf;
                        auVar69._8_4_ = 0x7f;
                        auVar69._0_8_ = 0x7f0000007f;
                        auVar69._12_4_ = 0x7f;
                        uVar116 = vpcmpgtd_avx512vl(auVar129,auVar69);
                        uVar116 = uVar116 & 0xf;
                        auVar70._8_4_ = 0x807fffff;
                        auVar70._0_8_ = 0x807fffff807fffff;
                        auVar70._12_4_ = 0x807fffff;
                        auVar130 = vpandd_avx512vl(auVar130,auVar70);
                        auVar129 = vpslld_avx(auVar129,0x17);
                        auVar71._8_4_ = 0x3f800000;
                        auVar71._0_8_ = 0x3f8000003f800000;
                        auVar71._12_4_ = 0x3f800000;
                        auVar129 = vpaddd_avx512vl(auVar129,auVar71);
                        auVar129 = vpord_avx512vl(auVar129,auVar130);
                        auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar123 = (bool)((byte)uVar116 & 1);
                        in_ZmmResult._0_4_ =
                             (float)((uint)bVar123 * auVar130._0_4_ |
                                    (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar129._0_4_);
                        bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
                        in_ZmmResult._4_4_ =
                             (float)((uint)bVar123 * auVar130._4_4_ |
                                    (uint)!bVar123 *
                                    (uint)((byte)(uVar113 >> 1) & 1) * auVar129._4_4_);
                        bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
                        in_ZmmResult._8_4_ =
                             (float)((uint)bVar123 * auVar130._8_4_ |
                                    (uint)!bVar123 *
                                    (uint)((byte)(uVar113 >> 2) & 1) * auVar129._8_4_);
                        bVar123 = SUB81(uVar116 >> 3,0);
                        in_ZmmResult._12_4_ =
                             (float)((uint)bVar123 * auVar130._12_4_ |
                                    (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar129._12_4_);
                        local_5f8._4_4_ = in_ZmmResult._4_4_ * (float)local_5f8._4_4_;
                        local_5f8._0_4_ = in_ZmmResult._0_4_ * (float)local_5f8._0_4_;
                        fStack_5f0 = in_ZmmResult._8_4_ * fStack_5f0;
                        fStack_5ec = in_ZmmResult._12_4_ * fStack_5ec;
                        cVar124 = '\n';
                      }
                      else {
                        cVar124 = '\0';
                        if ((float)local_558._0_4_ <= fVar148) {
                          _local_578 = ZEXT416((uint)fVar148);
                        }
                        else {
                          local_528._0_4_ = auVar129._0_4_;
                          fVar194 = fVar148 - (float)local_578._0_4_;
                          auVar163._0_4_ = fVar194 * (float)local_548._0_4_;
                          auVar163._4_4_ = fVar194 * (float)local_548._4_4_;
                          auVar163._8_4_ = fVar194 * fStack_540;
                          auVar163._12_4_ = fVar194 * fStack_53c;
                          auVar58._8_4_ = 0x3fb8aa3b;
                          auVar58._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar58._12_4_ = 0x3fb8aa3b;
                          auVar129 = vmulps_avx512vl(auVar163,auVar58);
                          _local_458 = vroundps_avx(auVar129,9);
                          auVar129 = vsubps_avx(auVar129,_local_458);
                          auVar215._8_4_ = 0x3da00ac9;
                          auVar215._0_8_ = 0x3da00ac93da00ac9;
                          auVar215._12_4_ = 0x3da00ac9;
                          auVar59._8_4_ = 0x3e679a0b;
                          auVar59._0_8_ = 0x3e679a0b3e679a0b;
                          auVar59._12_4_ = 0x3e679a0b;
                          auVar126 = vfmadd213ps_avx512vl(auVar215,auVar129,auVar59);
                          auVar60._8_4_ = 0x3f321004;
                          auVar60._0_8_ = 0x3f3210043f321004;
                          auVar60._12_4_ = 0x3f321004;
                          auVar126 = vfmadd213ps_avx512vl(auVar126,auVar129,auVar60);
                          auVar61._8_4_ = 0x3f800000;
                          auVar61._0_8_ = 0x3f8000003f800000;
                          auVar61._12_4_ = 0x3f800000;
                          _local_448 = vfmadd213ps_avx512vl(auVar126,auVar129,auVar61);
                          fVar195 = fVar148 * uStack_5d0._4_4_ + local_5d8._0_4_;
                          fVar308 = fVar148 * (float)uStack_5c8 + local_5d8._4_4_;
                          local_478 = CONCAT412(fVar148 * 0.0 + 0.0,
                                                CONCAT48(fVar148 * 0.0 + 0.0,
                                                         CONCAT44(fVar308,fVar195)));
                          fVar194 = fVar148 * uStack_5c8._4_4_ + (float)uStack_5d0;
                          local_4d8._0_4_ = fVar194;
                          PVar322.super_Tuple3<pbrt::Point3,_float>.z = fVar194;
                          PVar322.super_Tuple3<pbrt::Point3,_float>.x = fVar195;
                          PVar322.super_Tuple3<pbrt::Point3,_float>.y = fVar308;
                          auVar248 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                          auVar197 = ZEXT856(local_478._8_8_);
                          _local_418 = ZEXT416((uint)fVar148);
                          SVar323 = CloudMediumProvider::Density
                                              ((CloudMediumProvider *)*puVar121,PVar322,lambda);
                          auVar240._0_8_ = SVar323.values.values._8_8_;
                          auVar240._8_56_ = auVar248;
                          auVar189._0_8_ = SVar323.values.values._0_8_;
                          auVar189._8_56_ = auVar197;
                          auVar129 = vmovshdup_avx(local_478);
                          fVar195 = auVar129._0_4_;
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 *
                                                                   *(float *)((long)puVar121 + 0x7c)
                                                                   )),local_478,
                                                     ZEXT416(*(uint *)(puVar121 + 0xf)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_4d8._0_4_),
                                                     ZEXT416(*(uint *)(puVar121 + 0x10)));
                          fVar148 = auVar129._0_4_ + *(float *)((long)puVar121 + 0x84);
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 *
                                                                   *(float *)((long)puVar121 + 0x8c)
                                                                   )),local_478,
                                                     ZEXT416(*(uint *)(puVar121 + 0x11)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_4d8._0_4_),
                                                     ZEXT416(*(uint *)(puVar121 + 0x12)));
                          fVar194 = auVar129._0_4_ + *(float *)((long)puVar121 + 0x94);
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 *
                                                                   *(float *)((long)puVar121 + 0x9c)
                                                                   )),local_478,
                                                     ZEXT416(*(uint *)(puVar121 + 0x13)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_4d8._0_4_),
                                                     ZEXT416(*(uint *)(puVar121 + 0x14)));
                          auVar126 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 *
                                                                   *(float *)((long)puVar121 + 0xac)
                                                                   )),local_478,
                                                     ZEXT416(*(uint *)(puVar121 + 0x15)));
                          auVar126 = vfmadd231ss_fma(auVar126,ZEXT416((uint)local_4d8._0_4_),
                                                     ZEXT416(*(uint *)(puVar121 + 0x16)));
                          fVar195 = auVar126._0_4_ + *(float *)((long)puVar121 + 0xb4);
                          bVar123 = fVar195 == 1.0;
                          fVar308 = auVar129._0_4_ + *(float *)((long)puVar121 + 0xa4);
                          auVar216._0_4_ = local_4f4._4_4_ * local_4f4._4_4_;
                          auVar216._4_4_ = local_4f4._8_4_ * local_4f4._8_4_;
                          auVar216._8_8_ = 0;
                          auVar129 = vmovshdup_avx(auVar216);
                          fVar149 = (float)local_4f4._0_4_ * (float)local_4f4._0_4_ + auVar216._0_4_
                                    + auVar129._0_4_;
                          if (fVar149 < 0.0) {
                            local_4d8 = ZEXT416((uint)fVar148);
                            local_298 = ZEXT416((uint)fVar194);
                            local_2a8 = ZEXT416((uint)fVar308);
                            local_2b8._0_4_ = fVar195;
                            local_478 = auVar189._0_16_;
                            local_288 = auVar240._0_16_;
                            fVar149 = sqrtf(fVar149);
                            fVar195 = (float)local_2b8._0_4_;
                            auVar126 = local_478;
                            auVar129 = local_288;
                            auVar128 = local_4d8;
                            fVar194 = (float)local_298._0_4_;
                            fVar308 = (float)local_2a8._0_4_;
                          }
                          else {
                            auVar129 = vsqrtss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
                            fVar149 = auVar129._0_4_;
                            auVar126 = auVar189._0_16_;
                            auVar129 = auVar240._0_16_;
                            auVar128 = ZEXT416((uint)fVar148);
                          }
                          auVar218._0_4_ = (int)(float)local_458._0_4_;
                          auVar218._4_4_ = (int)(float)local_458._4_4_;
                          auVar218._8_4_ = (int)fStack_450;
                          auVar218._12_4_ = (int)fStack_44c;
                          auVar255 = vpsrld_avx(_local_448,0x17);
                          auVar279._8_4_ = 0xffffff81;
                          auVar279._0_8_ = 0xffffff81ffffff81;
                          auVar279._12_4_ = 0xffffff81;
                          auVar156 = vpaddd_avx(auVar218,auVar279);
                          auVar156 = vpaddd_avx(auVar156,auVar255);
                          uVar113 = vpcmpgtd_avx512vl(auVar156,auVar279);
                          uVar113 = uVar113 & 0xf;
                          auVar62._8_4_ = 0x7f;
                          auVar62._0_8_ = 0x7f0000007f;
                          auVar62._12_4_ = 0x7f;
                          uVar116 = vpcmpgtd_avx512vl(auVar156,auVar62);
                          uVar116 = uVar116 & 0xf;
                          auVar63._8_4_ = 0x807fffff;
                          auVar63._0_8_ = 0x807fffff807fffff;
                          auVar63._12_4_ = 0x807fffff;
                          auVar255 = vpandd_avx512vl(_local_448,auVar63);
                          auVar156 = vpslld_avx(auVar156,0x17);
                          auVar64._8_4_ = 0x3f800000;
                          auVar64._0_8_ = 0x3f8000003f800000;
                          auVar64._12_4_ = 0x3f800000;
                          auVar156 = vpaddd_avx512vl(auVar156,auVar64);
                          auVar255 = vpord_avx512vl(auVar156,auVar255);
                          auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                          bVar10 = (bool)((byte)uVar116 & 1);
                          bVar7 = (bool)((byte)(uVar116 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar116 >> 2) & 1);
                          bVar9 = SUB81(uVar116 >> 3,0);
                          auVar129 = vmovlhps_avx(auVar126,auVar129);
                          auVar280._0_4_ = auVar129._0_4_ * local_268;
                          auVar280._4_4_ = auVar129._4_4_ * fStack_264;
                          auVar280._8_4_ = auVar129._8_4_ * fStack_260;
                          auVar280._12_4_ = auVar129._12_4_ * fStack_25c;
                          auVar126 = vshufpd_avx(auVar280,auVar280,1);
                          auVar260._0_4_ = auVar129._0_4_ * (float)local_278;
                          auVar260._4_4_ = auVar129._4_4_ * local_278._4_4_;
                          auVar260._8_4_ = auVar129._8_4_ * fStack_270;
                          auVar260._12_4_ = auVar129._12_4_ * fStack_26c;
                          auVar156 = vshufpd_avx(auVar260,auVar260,1);
                          fVar148 = auVar128._0_4_ / fVar195;
                          auVar142._4_12_ = auVar128._4_12_;
                          auVar142._0_4_ = fVar148;
                          auVar142._16_48_ = in_ZmmResult._16_48_;
                          auVar141._4_60_ = auVar142._4_60_;
                          auVar141._0_4_ =
                               (uint)bVar123 * (int)auVar128._0_4_ + (uint)!bVar123 * (int)fVar148;
                          iVar112 = (uint)bVar123 * (int)fVar194 +
                                    (uint)!bVar123 * (int)(fVar194 / fVar195);
                          iVar125 = (uint)bVar123 * (int)fVar308 +
                                    (uint)!bVar123 * (int)(fVar308 / fVar195);
                          auVar314._0_8_ = local_4f4._0_8_ ^ 0x8000000080000000;
                          auVar314._8_4_ = 0x80000000;
                          auVar314._12_4_ = 0x80000000;
                          auVar318._4_4_ = fVar149;
                          auVar318._0_4_ = fVar149;
                          auVar318._8_4_ = fVar149;
                          auVar318._12_4_ = fVar149;
                          auVar129 = vdivps_avx(auVar314,auVar318);
                          auVar319._0_4_ = -(float)local_4f4._8_4_;
                          auVar319._4_4_ = 0x80000000;
                          auVar319._8_4_ = 0x80000000;
                          auVar319._12_4_ = 0x80000000;
                          auVar165._0_4_ = auVar319._0_4_ / fVar149;
                          auVar165._4_12_ = auVar319._4_12_;
                          auVar303._4_4_ = iVar112;
                          auVar303._0_4_ = iVar112;
                          auVar303._8_4_ = iVar112;
                          auVar303._12_4_ = iVar112;
                          auVar310._4_4_ = iVar125;
                          auVar310._0_4_ = iVar125;
                          auVar310._8_4_ = iVar125;
                          auVar310._12_4_ = iVar125;
                          local_348 = ZEXT816(0);
                          local_338 = 0.0;
                          auVar128 = vshufps_avx(auVar141._0_16_,auVar303,0x40);
                          local_370._0_8_ = auVar128._0_8_;
                          local_370._8_4_ = auVar128._8_4_;
                          local_370._12_4_ = auVar128._12_4_;
                          uVar198 = vmovlps_avx(auVar310);
                          local_370._16_4_ = (undefined4)uVar198;
                          local_370._20_4_ = (undefined4)((ulong)uVar198 >> 0x20);
                          local_370._24_4_ = FStack_4e8;
                          uVar198 = vmovlps_avx(auVar129);
                          fStack_354 = (float)uVar198;
                          fStack_350 = (float)((ulong)uVar198 >> 0x20);
                          local_330 = (MediumInterface *)0x0;
                          local_328.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                   )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                     )local_438._0_8_;
                          auVar176._16_16_ = auVar156;
                          auVar176._0_16_ = auVar165;
                          auVar294._16_16_ = auVar126;
                          auVar294._0_16_ = auVar165;
                          auVar177 = vperm2f128_avx(auVar294,auVar176,0x31);
                          auVar267._16_16_ = auVar260;
                          auVar267._0_16_ = auVar280;
                          local_318 = vunpcklpd_avx(auVar267,auVar177);
                          local_2f8 = ZEXT1632(_local_598);
                          local_2d8.values.values[1] =
                               (float)((uint)bVar7 * auVar131._4_4_ |
                                      (uint)!bVar7 *
                                      (uint)((byte)(uVar113 >> 1) & 1) * auVar255._4_4_) *
                               (float)local_5f8._4_4_;
                          local_2d8.values.values[0] =
                               (float)((uint)bVar10 * auVar131._0_4_ |
                                      (uint)!bVar10 * (uint)((byte)uVar113 & 1) * auVar255._0_4_) *
                               (float)local_5f8._0_4_;
                          local_2d8.values.values[2] =
                               (float)((uint)bVar8 * auVar131._8_4_ |
                                      (uint)!bVar8 *
                                      (uint)((byte)(uVar113 >> 2) & 1) * auVar255._8_4_) *
                               fStack_5f0;
                          local_2d8.values.values[3] =
                               (float)((uint)bVar9 * auVar131._12_4_ |
                                      (uint)!bVar9 * (uint)(byte)(uVar113 >> 3) * auVar255._12_4_) *
                               fStack_5ec;
                          auVar178 = ZEXT1664(auVar310);
                          auVar183 = ZEXT1664(auVar130);
                          fStack_34c = auVar165._0_4_;
                          local_320.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                               (TaggedPointer<pbrt::HGPhaseFunction>)
                               (TaggedPointer<pbrt::HGPhaseFunction>)
                               ((long)puVar121 + 0x74U | 0x1000000000000);
                          bVar123 = SampleLd::anon_class_32_4_3820c045::operator()
                                              (&local_3b8,(MediumSample *)local_370);
                          if (!bVar123) {
                            local_d8._8_4_ = 0x3f800000;
                            local_d8._0_8_ = 0x3f8000003f800000;
                            local_d8._12_4_ = 0x3f800000;
                          }
                          auVar143._16_48_ = in_ZmmResult._16_48_;
                          auVar143._0_16_ = _local_578;
                          in_ZmmResult._4_60_ = auVar143._4_60_;
                          in_ZmmResult._0_4_ =
                               (float)((uint)bVar123 * local_418._0_4_ +
                                      (uint)!bVar123 * local_578._0_4_);
                          _local_578 = in_ZmmResult._0_16_;
                          cVar124 = !bVar123;
                          fStack_5f0 = 1.0;
                          local_5f8 = (undefined1  [8])0x3f8000003f800000;
                          fStack_5ec = 1.0;
                          auVar289 = ZEXT464((uint)local_528._0_4_);
                          lambda = local_3c0;
                        }
                      }
                    } while (cVar124 == '\0');
                    auVar129 = _local_578;
                    if (cVar124 == '\n') {
                      auVar288 = ZEXT1664(local_388);
                      auVar130 = ZEXT416((uint)local_538._0_4_);
                      goto LAB_0040142d;
                    }
                    auVar307 = ZEXT464((uint)local_558._0_4_);
                    auVar288 = ZEXT1664(local_388);
                  }
                  else {
                    fVar148 = auVar130._0_4_ - auVar129._0_4_;
                    auVar162._0_4_ = fVar148 * in_ZmmResult._0_4_;
                    auVar162._4_4_ = fVar148 * in_ZmmResult._4_4_;
                    auVar162._8_4_ = fVar148 * in_ZmmResult._8_4_;
                    auVar162._12_4_ = fVar148 * in_ZmmResult._12_4_;
                    auVar51._8_4_ = 0x3fb8aa3b;
                    auVar51._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar51._12_4_ = 0x3fb8aa3b;
                    auVar128 = vmulps_avx512vl(auVar162,auVar51);
                    auVar126 = vroundps_avx(auVar128,9);
                    auVar128 = vsubps_avx(auVar128,auVar126);
                    auVar214._0_4_ = (int)auVar126._0_4_;
                    auVar214._4_4_ = (int)auVar126._4_4_;
                    auVar214._8_4_ = (int)auVar126._8_4_;
                    auVar214._12_4_ = (int)auVar126._12_4_;
                    auVar258._8_4_ = 0x3da00ac9;
                    auVar258._0_8_ = 0x3da00ac93da00ac9;
                    auVar258._12_4_ = 0x3da00ac9;
                    auVar52._8_4_ = 0x3e679a0b;
                    auVar52._0_8_ = 0x3e679a0b3e679a0b;
                    auVar52._12_4_ = 0x3e679a0b;
                    auVar126 = vfmadd213ps_avx512vl(auVar258,auVar128,auVar52);
                    auVar53._8_4_ = 0x3f321004;
                    auVar53._0_8_ = 0x3f3210043f321004;
                    auVar53._12_4_ = 0x3f321004;
                    auVar126 = vfmadd213ps_avx512vl(auVar126,auVar128,auVar53);
                    auVar54._8_4_ = 0x3f800000;
                    auVar54._0_8_ = 0x3f8000003f800000;
                    auVar54._12_4_ = 0x3f800000;
                    auVar128 = vfmadd213ps_avx512vl(auVar126,auVar128,auVar54);
                    auVar156 = vpsrld_avx(auVar128,0x17);
                    auVar277._8_4_ = 0xffffff81;
                    auVar277._0_8_ = 0xffffff81ffffff81;
                    auVar277._12_4_ = 0xffffff81;
                    auVar126 = vpaddd_avx(auVar214,auVar277);
                    auVar126 = vpaddd_avx(auVar126,auVar156);
                    uVar113 = vpcmpgtd_avx512vl(auVar126,auVar277);
                    uVar113 = uVar113 & 0xf;
                    auVar55._8_4_ = 0x7f;
                    auVar55._0_8_ = 0x7f0000007f;
                    auVar55._12_4_ = 0x7f;
                    uVar116 = vpcmpgtd_avx512vl(auVar126,auVar55);
                    uVar116 = uVar116 & 0xf;
                    auVar56._8_4_ = 0x807fffff;
                    auVar56._0_8_ = 0x807fffff807fffff;
                    auVar56._12_4_ = 0x807fffff;
                    auVar128 = vpandd_avx512vl(auVar128,auVar56);
                    auVar126 = vpslld_avx(auVar126,0x17);
                    auVar57._8_4_ = 0x3f800000;
                    auVar57._0_8_ = 0x3f8000003f800000;
                    auVar57._12_4_ = 0x3f800000;
                    auVar126 = vpaddd_avx512vl(auVar126,auVar57);
                    auVar126 = vpord_avx512vl(auVar126,auVar128);
                    auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar123 = (bool)((byte)uVar116 & 1);
                    in_ZmmResult._0_4_ =
                         (float)((uint)bVar123 * auVar128._0_4_ |
                                (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar126._0_4_);
                    bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
                    in_ZmmResult._4_4_ =
                         (float)((uint)bVar123 * auVar128._4_4_ |
                                (uint)!bVar123 * (uint)((byte)(uVar113 >> 1) & 1) * auVar126._4_4_);
                    bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
                    in_ZmmResult._8_4_ =
                         (float)((uint)bVar123 * auVar128._8_4_ |
                                (uint)!bVar123 * (uint)((byte)(uVar113 >> 2) & 1) * auVar126._8_4_);
                    bVar123 = SUB81(uVar116 >> 3,0);
                    in_ZmmResult._12_4_ =
                         (float)((uint)bVar123 * auVar128._12_4_ |
                                (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar126._12_4_);
                    local_5f8._4_4_ = in_ZmmResult._4_4_ * (float)local_5f8._4_4_;
                    local_5f8._0_4_ = in_ZmmResult._0_4_ * (float)local_5f8._0_4_;
                    fStack_5f0 = in_ZmmResult._8_4_ * fStack_5f0;
                    fStack_5ec = in_ZmmResult._12_4_ * fStack_5ec;
LAB_0040142d:
                    auVar307 = ZEXT464((uint)local_558._0_4_);
                    cVar124 = '\b';
                    if ((local_5e4[iVar105] <= (float)local_558._0_4_) &&
                       (iVar112 = local_584[iVar105],
                       local_584[iVar105] = iVar112 + aiStack_4b0[iVar105],
                       iVar112 + aiStack_4b0[iVar105] != aiStack_394[iVar105])) {
                      local_5e4[iVar105] = local_5e4[iVar105] + afStack_4a4[iVar105];
                      cVar124 = '\0';
                      auVar129 = auVar130;
                    }
                  }
                } while (cVar124 == '\0');
                auVar135 = local_d8;
                if (cVar124 == '\b') {
                  auVar135 = _local_5f8;
                }
              }
              auVar129 = vshufpd_avx(auVar135,auVar135,1);
              local_d8 = auVar135;
            }
            else {
              local_500 = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar132);
              local_4f8 = IStack_250.low;
              local_4e0.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                         )local_238.bits;
              local_3b8.T_ray = &local_468;
              local_3b8.lightPathPDF = &local_4c8;
              local_3b8.uniPathPDF = &local_428;
              local_3b8.rng = &local_518;
              auVar178 = ZEXT1664(auVar129);
              auVar183 = ZEXT1664(auVar130);
              local_5fc = fVar148;
              Transform::ApplyInverse
                        ((Ray *)local_5d8,(Transform *)(puVar121 + 0xf),(Ray *)&local_500,&local_5fc
                        );
              auVar130._0_4_ = (float)uStack_5c8 * (float)uStack_5c8;
              auVar130._4_4_ = uStack_5c8._4_4_ * uStack_5c8._4_4_;
              auVar130._8_8_ = 0;
              auVar129 = vmovshdup_avx(auVar130);
              fVar148 = uStack_5d0._4_4_ * uStack_5d0._4_4_ + auVar130._0_4_ + auVar129._0_4_;
              if (fVar148 < 0.0) {
                fVar148 = sqrtf(fVar148);
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              else {
                auVar129 = vsqrtss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                fVar148 = auVar129._0_4_;
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              uStack_5c8._4_4_ = (float)((ulong)pSVar99 >> 0x20);
              uStack_5c8._0_4_ = SUB84(pSVar99,0);
              uStack_5d0._4_4_ = (float)((ulong)pSVar98 >> 0x20);
              local_5fc = fVar148 * local_5fc;
              auVar203._0_4_ = (float)uStack_5c8 * (float)uStack_5c8;
              auVar203._4_4_ = uStack_5c8._4_4_ * uStack_5c8._4_4_;
              auVar203._8_8_ = 0;
              auVar129 = vmovshdup_avx(auVar203);
              fVar148 = uStack_5d0._4_4_ * uStack_5d0._4_4_ + auVar203._0_4_ + auVar129._0_4_;
              if (fVar148 < 0.0) {
                uStack_5d0 = pSVar98;
                uStack_5c8 = pSVar99;
                fVar148 = sqrtf(fVar148);
                pSVar98 = uStack_5d0;
                pSVar99 = uStack_5c8;
              }
              else {
                auVar129 = vsqrtss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                fVar148 = auVar129._0_4_;
              }
              uStack_5c8._4_4_ = (float)((ulong)pSVar99 >> 0x20);
              uStack_5c8._0_4_ = SUB84(pSVar99,0);
              uStack_5d0._4_4_ = (float)((ulong)pSVar98 >> 0x20);
              uStack_5d0._0_4_ = SUB84(pSVar98,0);
              auVar219._4_4_ = (float)uStack_5c8;
              auVar219._0_4_ = uStack_5d0._4_4_;
              auVar219._8_8_ = 0;
              auVar261._4_4_ = fVar148;
              auVar261._0_4_ = fVar148;
              auVar261._8_4_ = fVar148;
              auVar261._12_4_ = fVar148;
              auVar129 = vdivps_avx(auVar219,auVar261);
              uVar198 = vmovlps_avx(auVar129);
              uStack_5d0._4_4_ = (float)uVar198;
              uStack_5c8._0_4_ = (float)((ulong)uVar198 >> 0x20);
              uStack_5c8._4_4_ = uStack_5c8._4_4_ / fVar148;
              auVar288 = ZEXT464((uint)local_5fc);
              auVar129 = ZEXT816(0) << 0x40;
              bVar123 = false;
              uVar106 = 0;
              do {
                pfVar122 = (float *)((long)&uStack_5d0 + 4);
                if ((uVar106 != 0) && (pfVar122 = (float *)&uStack_5c8, uVar106 != 1)) {
                  pfVar122 = (float *)((long)&uStack_5c8 + 4);
                }
                pfVar114 = (float *)(puVar121 + 1);
                if ((uVar106 != 0) && (pfVar114 = (float *)((long)puVar121 + 0xc), uVar106 != 1)) {
                  pfVar114 = (float *)(puVar121 + 2);
                }
                pRVar118 = (Ray *)local_5d8;
                if ((uVar106 != 0) && (pRVar118 = (Ray *)(local_5d8 + 4), uVar106 != 1)) {
                  pRVar118 = (Ray *)&uStack_5d0;
                }
                pfVar119 = (float *)((long)puVar121 + 0x14);
                if ((uVar106 != 0) && (pfVar119 = (float *)(puVar121 + 3), uVar106 != 1)) {
                  pfVar119 = (float *)((long)puVar121 + 0x1c);
                }
                pRVar120 = (Ray *)local_5d8;
                if ((uVar106 != 0) && (pRVar120 = (Ray *)(local_5d8 + 4), uVar106 != 1)) {
                  pRVar120 = (Ray *)&uStack_5d0;
                }
                auVar197 = (undefined1  [56])0x0;
                auVar126 = ZEXT416((uint)((1.0 / *pfVar122) *
                                         (*pfVar119 -
                                         (pRVar120->o).super_Tuple3<pbrt::Point3,_float>.x)));
                auVar128 = ZEXT416((uint)((1.0 / *pfVar122) *
                                         (*pfVar114 -
                                         (pRVar118->o).super_Tuple3<pbrt::Point3,_float>.x)));
                auVar130 = vminss_avx(auVar126,auVar128);
                auVar129 = vmaxss_avx(auVar130,auVar129);
                auVar130 = vmaxss_avx(auVar128,auVar126);
                auVar130 = vminss_avx(ZEXT416((uint)(auVar130._0_4_ * 1.0000004)),auVar288._0_16_);
                auVar288 = ZEXT1664(auVar130);
                if (auVar130._0_4_ < auVar129._0_4_) break;
                bVar123 = 1 < uVar106;
                uVar106 = uVar106 + 1;
              } while (uVar106 != 3);
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              if (bVar123) {
                local_5f8._0_4_ = auVar129._0_4_;
                local_558._0_4_ = auVar130._0_4_;
                uVar198 = 0;
                _local_578 = ZEXT416(*(uint *)(puVar121 + 0xe));
                SVar323 = DenselySampledSpectrum::Sample
                                    ((DenselySampledSpectrum *)(puVar121 + 4),lambda);
                auVar241._0_8_ = SVar323.values.values._8_8_;
                auVar241._8_56_ = auVar197;
                uStack_590 = uVar198;
                local_598 = (undefined1  [8])SVar323.values.values._0_8_;
                _local_538 = auVar241._0_16_;
                auVar248 = (undefined1  [56])0x0;
                _local_548 = ZEXT416(*(uint *)(puVar121 + 0xe));
                SVar323 = DenselySampledSpectrum::Sample
                                    ((DenselySampledSpectrum *)(puVar121 + 9),lambda);
                auVar242._0_8_ = SVar323.values.values._8_8_;
                auVar242._8_56_ = auVar197;
                auVar190._0_8_ = SVar323.values.values._0_8_;
                auVar190._8_56_ = auVar248;
                auVar129 = vunpcklpd_avx(_local_598,_local_538);
                local_418._0_4_ = (float)local_578._0_4_ * auVar129._0_4_;
                local_418._4_4_ = (float)local_578._0_4_ * auVar129._4_4_;
                fStack_410 = (float)local_578._0_4_ * auVar129._8_4_;
                fStack_40c = (float)local_578._0_4_ * auVar129._12_4_;
                auVar129 = vmovlhps_avx(auVar190._0_16_,auVar242._0_16_);
                local_268 = (float)local_548._0_4_ * auVar129._0_4_;
                fStack_264 = (float)local_548._0_4_ * auVar129._4_4_;
                fStack_260 = (float)local_548._0_4_ * auVar129._8_4_;
                fStack_25c = (float)local_548._0_4_ * auVar129._12_4_;
                local_2c8._0_4_ = local_268 + (float)local_418._0_4_;
                local_2c8._4_4_ = fStack_264 + (float)local_418._4_4_;
                local_2c8._8_4_ = fStack_260 + fStack_410;
                local_2c8._12_4_ = fStack_25c + fStack_40c;
                auVar307 = ZEXT1664(local_2c8);
                fVar148 = *(float *)(puVar121 + 2);
                fVar308 = *(float *)((long)puVar121 + 0x1c) - fVar148;
                uVar198 = vcmpss_avx512f(ZEXT416((uint)fVar148),
                                         ZEXT416((uint)*(float *)((long)puVar121 + 0x1c)),1);
                bVar10 = (bool)((byte)uVar198 & 1);
                auVar166._8_8_ = 0;
                auVar166._0_8_ = puVar121[1];
                auVar220._8_8_ = 0;
                auVar220._0_8_ = *(ulong *)((long)puVar121 + 0x14);
                auVar129 = vsubps_avx(auVar220,auVar166);
                auVar300._8_8_ = 0;
                auVar300._0_8_ = local_5d8;
                auVar130 = vsubps_avx(auVar300,auVar166);
                uVar113 = vcmpps_avx512vl(auVar166,auVar220,1);
                auVar126 = vdivps_avx512vl(auVar130,auVar129);
                bVar123 = (bool)((byte)uVar113 & 1);
                auVar134._0_4_ =
                     (float)((uint)bVar123 * auVar126._0_4_ | (uint)!bVar123 * auVar130._0_4_);
                bVar123 = (bool)((byte)(uVar113 >> 1) & 1);
                auVar134._4_4_ = (uint)bVar123 * auVar126._4_4_ | (uint)!bVar123 * auVar130._4_4_;
                bVar123 = (bool)((byte)(uVar113 >> 2) & 1);
                auVar134._8_4_ = (uint)bVar123 * auVar126._8_4_ | (uint)!bVar123 * auVar130._8_4_;
                bVar123 = (bool)((byte)(uVar113 >> 3) & 1);
                auVar134._12_4_ = (uint)bVar123 * auVar126._12_4_ | (uint)!bVar123 * auVar130._12_4_
                ;
                in_ZmmResult._0_16_ = auVar134;
                auVar130 = vmovshdup_avx(auVar134);
                auVar167._4_4_ = (float)uStack_5c8;
                auVar167._0_4_ = uStack_5d0._4_4_;
                auVar167._8_8_ = 0;
                auVar129 = vdivps_avx(auVar167,auVar129);
                local_504 = uStack_5c8._4_4_ / fVar308;
                local_5b0 = vmovlps_avx(auVar129);
                MVar101.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                         )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                           )local_5b0;
                auVar288 = ZEXT464((uint)local_5f8._0_4_);
                local_5b0._4_4_ = (float)(local_5b0 >> 0x20);
                fVar194 = (float)local_5f8._0_4_ * (float)local_5b0 + auVar134._0_4_;
                fVar195 = (float)local_5f8._0_4_ * local_5b0._4_4_ + auVar130._0_4_;
                fVar148 = (float)((uint)bVar10 * (int)(((float)uStack_5d0 - fVar148) / fVar308) +
                                 (uint)!bVar10 * (int)((float)uStack_5d0 - fVar148)) +
                          (float)local_5f8._0_4_ * local_504;
                piVar1 = (int *)(puVar121 + 0x23);
                piVar2 = (int *)((long)puVar121 + 0x11c);
                piVar3 = (int *)(puVar121 + 0x24);
                lVar111 = 0;
                pfVar122 = (float *)((long)&local_5b0 + 4);
                local_5b0 = (uintptr_t)
                            MVar101.
                            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                            .bits;
                do {
                  iVar105 = (int)lVar111;
                  fVar308 = fVar194;
                  if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                    fVar308 = fVar148;
                  }
                  piVar115 = piVar1;
                  if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                    piVar115 = piVar3;
                  }
                  piVar117 = piVar1;
                  if ((iVar105 != 0) && (piVar117 = piVar2, iVar105 != 1)) {
                    piVar117 = piVar3;
                  }
                  auVar292._0_4_ = (float)(*piVar117 + -1);
                  auVar292._4_12_ = auVar178._4_12_;
                  auVar129 = vminss_avx(auVar292,ZEXT416((uint)(fVar308 * (float)*piVar115)));
                  uVar198 = vcmpss_avx512f(ZEXT416((uint)(fVar308 * (float)*piVar115)),
                                           ZEXT816(0) << 0x40,1);
                  auVar144._16_48_ = in_ZmmResult._16_48_;
                  auVar144._0_16_ = auVar129;
                  fVar308 = (float)((uint)!(bool)((byte)uVar198 & 1) * auVar129._0_4_);
                  in_ZmmResult._4_60_ = auVar144._4_60_;
                  in_ZmmResult._0_4_ = fVar308;
                  iVar112 = (int)fVar308;
                  local_584[lVar111] = iVar112;
                  pfVar114 = (float *)&local_5b0;
                  if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                    pfVar114 = &local_504;
                  }
                  if ((*pfVar114 == 0.0) && (!NAN(*pfVar114))) {
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    *pfVar114 = 0.0;
                  }
                  auVar177 = _local_578;
                  pfVar114 = (float *)&local_5b0;
                  if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                    pfVar114 = &local_504;
                  }
                  if (0.0 <= *pfVar114) {
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    fVar308 = fVar194;
                    if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                      fVar308 = fVar148;
                    }
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    local_5e4[lVar111] =
                         (float)local_5f8._0_4_ +
                         ((float)(iVar112 + 1) / (float)*piVar115 - fVar308) / *pfVar114;
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    afStack_4a4[lVar111] = 1.0 / ((float)*piVar115 * *pfVar114);
                    aiStack_4b0[lVar111] = 1;
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    iVar105 = *piVar115;
                  }
                  else {
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    fVar308 = fVar194;
                    if ((iVar105 != 0) && (fVar308 = fVar195, iVar105 != 1)) {
                      fVar308 = fVar148;
                    }
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    local_5e4[lVar111] =
                         (float)local_5f8._0_4_ +
                         ((float)iVar112 / (float)*piVar115 - fVar308) / *pfVar114;
                    pfVar114 = (float *)&local_5b0;
                    if ((iVar105 != 0) && (pfVar114 = pfVar122, iVar105 != 1)) {
                      pfVar114 = &local_504;
                    }
                    piVar115 = piVar1;
                    if ((iVar105 != 0) && (piVar115 = piVar2, iVar105 != 1)) {
                      piVar115 = piVar3;
                    }
                    afStack_4a4[lVar111] = -1.0 / ((float)*piVar115 * *pfVar114);
                    aiStack_4b0[lVar111] = -1;
                    iVar105 = -1;
                  }
                  aiStack_394[lVar111] = iVar105;
                  lVar111 = lVar111 + 1;
                } while (lVar111 != 3);
                local_278 = (long)puVar121 + 0x74U | 0x1000000000000;
                fStack_570 = 1.0;
                local_578 = (undefined1  [8])0x3f8000003f800000;
                auStack_568 = auVar177._16_16_;
                fStack_56c = 1.0;
                auVar296 = ZEXT464((uint)local_528._0_4_);
                auVar289 = ZEXT464((uint)local_558._0_4_);
                do {
                  auVar177 = _local_578;
                  auVar130 = auVar288._0_16_;
                  iVar105 = *(int *)(&DAT_005841e0 +
                                    (ulong)((uint)(local_5e4[1] < local_5e4[2]) |
                                           (uint)(local_5e4[0] < local_5e4[1]) * 4 +
                                           (uint)(local_5e4[0] < local_5e4[2]) * 2) * 4);
                  uVar4 = *(undefined4 *)
                           (puVar121[0x20] +
                           (((long)local_584[2] * (long)*(int *)((long)puVar121 + 0x11c) +
                            (long)local_584[1]) * (long)*(int *)(puVar121 + 0x23) +
                           (long)local_584[0]) * 4);
                  auVar72._4_4_ = uVar4;
                  auVar72._0_4_ = uVar4;
                  auVar72._8_4_ = uVar4;
                  auVar72._12_4_ = uVar4;
                  auVar126 = vmulps_avx512vl(auVar307._0_16_,auVar72);
                  auVar129 = vminss_avx(ZEXT416((uint)local_5e4[iVar105]),auVar289._0_16_);
                  auVar73._8_4_ = 0x80000000;
                  auVar73._0_8_ = 0x8000000080000000;
                  auVar73._12_4_ = 0x80000000;
                  in_ZmmResult._0_16_ = vxorps_avx512vl(auVar126,auVar73);
                  if ((auVar126._0_4_ != 0.0) || (NAN(auVar126._0_4_))) {
                    local_538._0_4_ = auVar129._0_4_;
                    local_5f8._0_4_ = auVar288._0_4_;
                    _local_598 = auVar126;
                    _local_548 = in_ZmmResult._0_16_;
                    do {
                      fVar148 = logf(1.0 - auVar296._0_4_);
                      uVar102 = local_518.state;
                      auVar177 = _local_578;
                      fVar148 = (float)local_5f8._0_4_ - fVar148 / (float)local_598._0_4_;
                      local_518.state = local_518.state * 0x5851f42d4c957f2d + local_518.inc;
                      uVar106 = (uint)(uVar102 >> 0x2d) ^ (uint)(uVar102 >> 0x1b);
                      bVar109 = (byte)(uVar102 >> 0x3b);
                      auVar129 = vcvtusi2ss_avx512f(in_XMM14,uVar106 >> bVar109 |
                                                             uVar106 << 0x20 - bVar109);
                      auVar129 = vminss_avx(ZEXT416((uint)(auVar129._0_4_ * 2.3283064e-10)),
                                            ZEXT416(0x3f7fffff));
                      auVar296 = ZEXT1664(auVar129);
                      if ((float)local_538._0_4_ <= fVar148) {
                        fVar148 = (float)local_538._0_4_ - (float)local_5f8._0_4_;
                        auVar170._0_4_ = fVar148 * (float)local_548._0_4_;
                        auVar170._4_4_ = fVar148 * (float)local_548._4_4_;
                        auVar170._8_4_ = fVar148 * fStack_540;
                        auVar170._12_4_ = fVar148 * fStack_53c;
                        auVar88._8_4_ = 0x3fb8aa3b;
                        auVar88._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar88._12_4_ = 0x3fb8aa3b;
                        auVar130 = vmulps_avx512vl(auVar170,auVar88);
                        auVar129 = vroundps_avx(auVar130,9);
                        auVar130 = vsubps_avx(auVar130,auVar129);
                        auVar225._0_4_ = (int)auVar129._0_4_;
                        auVar225._4_4_ = (int)auVar129._4_4_;
                        auVar225._8_4_ = (int)auVar129._8_4_;
                        auVar225._12_4_ = (int)auVar129._12_4_;
                        auVar263._8_4_ = 0x3da00ac9;
                        auVar263._0_8_ = 0x3da00ac93da00ac9;
                        auVar263._12_4_ = 0x3da00ac9;
                        auVar89._8_4_ = 0x3e679a0b;
                        auVar89._0_8_ = 0x3e679a0b3e679a0b;
                        auVar89._12_4_ = 0x3e679a0b;
                        auVar129 = vfmadd213ps_avx512vl(auVar263,auVar130,auVar89);
                        auVar90._8_4_ = 0x3f321004;
                        auVar90._0_8_ = 0x3f3210043f321004;
                        auVar90._12_4_ = 0x3f321004;
                        auVar129 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar90);
                        auVar91._8_4_ = 0x3f800000;
                        auVar91._0_8_ = 0x3f8000003f800000;
                        auVar91._12_4_ = 0x3f800000;
                        auVar130 = vfmadd213ps_avx512vl(auVar129,auVar130,auVar91);
                        auVar126 = vpsrld_avx(auVar130,0x17);
                        auVar282._8_4_ = 0xffffff81;
                        auVar282._0_8_ = 0xffffff81ffffff81;
                        auVar282._12_4_ = 0xffffff81;
                        auVar129 = vpaddd_avx(auVar225,auVar282);
                        auVar129 = vpaddd_avx(auVar129,auVar126);
                        uVar113 = vpcmpgtd_avx512vl(auVar129,auVar282);
                        uVar113 = uVar113 & 0xf;
                        auVar92._8_4_ = 0x7f;
                        auVar92._0_8_ = 0x7f0000007f;
                        auVar92._12_4_ = 0x7f;
                        uVar116 = vpcmpgtd_avx512vl(auVar129,auVar92);
                        uVar116 = uVar116 & 0xf;
                        auVar93._8_4_ = 0x807fffff;
                        auVar93._0_8_ = 0x807fffff807fffff;
                        auVar93._12_4_ = 0x807fffff;
                        auVar130 = vpandd_avx512vl(auVar130,auVar93);
                        auVar129 = vpslld_avx(auVar129,0x17);
                        auVar94._8_4_ = 0x3f800000;
                        auVar94._0_8_ = 0x3f8000003f800000;
                        auVar94._12_4_ = 0x3f800000;
                        auVar129 = vpaddd_avx512vl(auVar129,auVar94);
                        auVar129 = vpord_avx512vl(auVar129,auVar130);
                        auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar123 = (bool)((byte)uVar116 & 1);
                        in_ZmmResult._0_4_ =
                             (float)((uint)bVar123 * auVar130._0_4_ |
                                    (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar129._0_4_);
                        bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
                        in_ZmmResult._4_4_ =
                             (float)((uint)bVar123 * auVar130._4_4_ |
                                    (uint)!bVar123 *
                                    (uint)((byte)(uVar113 >> 1) & 1) * auVar129._4_4_);
                        bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
                        in_ZmmResult._8_4_ =
                             (float)((uint)bVar123 * auVar130._8_4_ |
                                    (uint)!bVar123 *
                                    (uint)((byte)(uVar113 >> 2) & 1) * auVar129._8_4_);
                        bVar123 = SUB81(uVar116 >> 3,0);
                        in_ZmmResult._12_4_ =
                             (float)((uint)bVar123 * auVar130._12_4_ |
                                    (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar129._12_4_);
                        local_578._4_4_ = in_ZmmResult._4_4_ * (float)local_578._4_4_;
                        local_578._0_4_ = in_ZmmResult._0_4_ * (float)local_578._0_4_;
                        fStack_570 = in_ZmmResult._8_4_ * fStack_570;
                        auStack_568 = auVar177._16_16_;
                        fStack_56c = in_ZmmResult._12_4_ * fStack_56c;
                        cVar124 = '\n';
                      }
                      else {
                        cVar124 = '\0';
                        if ((float)local_558._0_4_ <= fVar148) {
                          local_5f8._0_4_ = fVar148;
                        }
                        else {
                          local_528._0_4_ = auVar129._0_4_;
                          fVar194 = fVar148 - (float)local_5f8._0_4_;
                          auVar169._0_4_ = fVar194 * (float)local_548._0_4_;
                          auVar169._4_4_ = fVar194 * (float)local_548._4_4_;
                          auVar169._8_4_ = fVar194 * fStack_540;
                          auVar169._12_4_ = fVar194 * fStack_53c;
                          auVar81._8_4_ = 0x3fb8aa3b;
                          auVar81._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar81._12_4_ = 0x3fb8aa3b;
                          auVar129 = vmulps_avx512vl(auVar169,auVar81);
                          _local_448 = vroundps_avx(auVar129,9);
                          auVar129 = vsubps_avx(auVar129,_local_448);
                          auVar222._8_4_ = 0x3da00ac9;
                          auVar222._0_8_ = 0x3da00ac93da00ac9;
                          auVar222._12_4_ = 0x3da00ac9;
                          auVar82._8_4_ = 0x3e679a0b;
                          auVar82._0_8_ = 0x3e679a0b3e679a0b;
                          auVar82._12_4_ = 0x3e679a0b;
                          auVar130 = vfmadd213ps_avx512vl(auVar222,auVar129,auVar82);
                          auVar83._8_4_ = 0x3f321004;
                          auVar83._0_8_ = 0x3f3210043f321004;
                          auVar83._12_4_ = 0x3f321004;
                          auVar130 = vfmadd213ps_avx512vl(auVar130,auVar129,auVar83);
                          auVar84._8_4_ = 0x3f800000;
                          auVar84._0_8_ = 0x3f8000003f800000;
                          auVar84._12_4_ = 0x3f800000;
                          local_438 = vfmadd213ps_avx512vl(auVar130,auVar129,auVar84);
                          local_478 = ZEXT416((uint)fVar148);
                          auVar223._0_4_ = fVar148 * uStack_5d0._4_4_ + local_5d8._0_4_;
                          auVar223._4_4_ = fVar148 * (float)uStack_5c8 + local_5d8._4_4_;
                          auVar223._8_4_ = fVar148 * 0.0 + 0.0;
                          auVar223._12_4_ = fVar148 * 0.0 + 0.0;
                          auVar248 = ZEXT856(auVar223._8_8_);
                          local_5a8.super_Tuple3<pbrt::Point3,_float>.z =
                               fVar148 * uStack_5c8._4_4_ + (float)uStack_5d0;
                          auVar197 = (undefined1  [56])0x0;
                          uVar198 = vmovlps_avx(auVar223);
                          local_5a8.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar198;
                          local_5a8.super_Tuple3<pbrt::Point3,_float>.y =
                               (float)((ulong)uVar198 >> 0x20);
                          SVar323 = NanoVDBMediumProvider::Density
                                              ((NanoVDBMediumProvider *)*puVar121,&local_5a8,lambda)
                          ;
                          auVar243._0_8_ = SVar323.values.values._8_8_;
                          auVar243._8_56_ = auVar248;
                          auVar191._0_8_ = SVar323.values.values._0_8_;
                          auVar191._8_56_ = auVar197;
                          _local_458 = auVar191._0_16_;
                          local_4d8 = auVar243._0_16_;
                          SVar323 = NanoVDBMediumProvider::Le
                                              ((NanoVDBMediumProvider *)*puVar121,&local_5a8,lambda)
                          ;
                          auVar244._0_8_ = SVar323.values.values._8_8_;
                          auVar244._8_56_ = auVar248;
                          auVar192._0_8_ = SVar323.values.values._0_8_;
                          auVar192._8_56_ = auVar197;
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0x7c))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0xf)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x10)));
                          fVar148 = auVar129._0_4_ + *(float *)((long)puVar121 + 0x84);
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0x8c))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0x11)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x12)));
                          fVar194 = auVar129._0_4_ + *(float *)((long)puVar121 + 0x94);
                          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0x9c))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0x13)));
                          auVar129 = vfmadd231ss_fma(auVar129,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x14)));
                          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.y *
                                                  *(float *)((long)puVar121 + 0xac))),
                                                  ZEXT416((uint)local_5a8.
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                  ,ZEXT416(*(uint *)(puVar121 + 0x15)));
                          auVar130 = vfmadd231ss_fma(auVar130,ZEXT416((uint)local_5a8.
                                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar121 + 0x16)));
                          fVar195 = auVar130._0_4_ + *(float *)((long)puVar121 + 0xb4);
                          bVar123 = fVar195 == 1.0;
                          fVar308 = auVar129._0_4_ + *(float *)((long)puVar121 + 0xa4);
                          auVar224._0_4_ = local_4f4._4_4_ * local_4f4._4_4_;
                          auVar224._4_4_ = local_4f4._8_4_ * local_4f4._8_4_;
                          auVar224._8_8_ = 0;
                          auVar129 = vmovshdup_avx(auVar224);
                          fVar149 = (float)local_4f4._0_4_ * (float)local_4f4._0_4_ + auVar224._0_4_
                                    + auVar129._0_4_;
                          if (fVar149 < 0.0) {
                            local_2a8 = ZEXT416((uint)fVar148);
                            local_2b8 = ZEXT416((uint)fVar194);
                            local_388 = ZEXT416((uint)fVar308);
                            local_508 = fVar195;
                            local_298 = auVar244._0_16_;
                            local_288 = auVar192._0_16_;
                            fVar149 = sqrtf(fVar149);
                            fVar195 = local_508;
                            auVar129 = local_288;
                            auVar130 = local_298;
                            auVar126 = local_2a8;
                            auVar128 = local_388;
                            fVar194 = (float)local_2b8._0_4_;
                          }
                          else {
                            auVar129 = vsqrtss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
                            fVar149 = auVar129._0_4_;
                            auVar129 = auVar192._0_16_;
                            auVar130 = auVar244._0_16_;
                            auVar126 = ZEXT416((uint)fVar148);
                            auVar128 = ZEXT416((uint)fVar308);
                          }
                          auVar226._0_4_ = (int)(float)local_448._0_4_;
                          auVar226._4_4_ = (int)(float)local_448._4_4_;
                          auVar226._8_4_ = (int)fStack_440;
                          auVar226._12_4_ = (int)fStack_43c;
                          auVar255 = vpsrld_avx(local_438,0x17);
                          auVar283._8_4_ = 0xffffff81;
                          auVar283._0_8_ = 0xffffff81ffffff81;
                          auVar283._12_4_ = 0xffffff81;
                          auVar156 = vpaddd_avx(auVar226,auVar283);
                          auVar156 = vpaddd_avx(auVar156,auVar255);
                          uVar113 = vpcmpgtd_avx512vl(auVar156,auVar283);
                          uVar113 = uVar113 & 0xf;
                          auVar85._8_4_ = 0x7f;
                          auVar85._0_8_ = 0x7f0000007f;
                          auVar85._12_4_ = 0x7f;
                          uVar116 = vpcmpgtd_avx512vl(auVar156,auVar85);
                          uVar116 = uVar116 & 0xf;
                          auVar86._8_4_ = 0x807fffff;
                          auVar86._0_8_ = 0x807fffff807fffff;
                          auVar86._12_4_ = 0x807fffff;
                          auVar255 = vpandd_avx512vl(local_438,auVar86);
                          auVar156 = vpslld_avx(auVar156,0x17);
                          auVar87._8_4_ = 0x3f800000;
                          auVar87._0_8_ = 0x3f8000003f800000;
                          auVar87._12_4_ = 0x3f800000;
                          auVar156 = vpaddd_avx512vl(auVar156,auVar87);
                          auVar131 = vpord_avx512vl(auVar156,auVar255);
                          auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                          bVar10 = (bool)((byte)uVar116 & 1);
                          bVar7 = (bool)((byte)(uVar116 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar116 >> 2) & 1);
                          bVar9 = SUB81(uVar116 >> 3,0);
                          auVar156 = vmovlhps_avx(_local_458,local_4d8);
                          auVar284._0_4_ = auVar156._0_4_ * (float)local_418._0_4_;
                          auVar284._4_4_ = auVar156._4_4_ * (float)local_418._4_4_;
                          auVar284._8_4_ = auVar156._8_4_ * fStack_410;
                          auVar284._12_4_ = auVar156._12_4_ * fStack_40c;
                          auVar255 = vshufpd_avx(auVar284,auVar284,1);
                          auVar264._0_4_ = auVar156._0_4_ * local_268;
                          auVar264._4_4_ = auVar156._4_4_ * fStack_264;
                          auVar264._8_4_ = auVar156._8_4_ * fStack_260;
                          auVar264._12_4_ = auVar156._12_4_ * fStack_25c;
                          auVar156 = vshufpd_avx(auVar264,auVar264,1);
                          fVar148 = auVar126._0_4_ / fVar195;
                          auVar146._4_12_ = auVar126._4_12_;
                          auVar146._0_4_ = fVar148;
                          fVar308 = auVar128._0_4_ / fVar195;
                          auVar147._4_12_ = auVar128._4_12_;
                          auVar147._0_4_ = fVar308;
                          auVar146._16_48_ = in_ZmmResult._16_48_;
                          auVar145._4_60_ = auVar146._4_60_;
                          auVar145._0_4_ =
                               (uint)bVar123 * (int)auVar126._0_4_ + (uint)!bVar123 * (int)fVar148;
                          iVar112 = (uint)bVar123 * (int)fVar194 +
                                    (uint)!bVar123 * (int)(fVar194 / fVar195);
                          auVar147._16_48_ = in_ZmmResult._16_48_;
                          in_ZmmResult._4_60_ = auVar147._4_60_;
                          in_ZmmResult._0_4_ =
                               (float)((uint)bVar123 * (int)auVar128._0_4_ +
                                      (uint)!bVar123 * (int)fVar308);
                          auVar315._0_8_ = local_4f4._0_8_ ^ 0x8000000080000000;
                          auVar315._8_4_ = 0x80000000;
                          auVar315._12_4_ = 0x80000000;
                          auVar320._4_4_ = fVar149;
                          auVar320._0_4_ = fVar149;
                          auVar320._8_4_ = fVar149;
                          auVar320._12_4_ = fVar149;
                          auVar126 = vdivps_avx(auVar315,auVar320);
                          auVar321._0_4_ = -(float)local_4f4._8_4_;
                          auVar321._4_4_ = 0x80000000;
                          auVar321._8_4_ = 0x80000000;
                          auVar321._12_4_ = 0x80000000;
                          auVar171._0_4_ = auVar321._0_4_ / fVar149;
                          auVar171._4_12_ = auVar321._4_12_;
                          auVar304._4_4_ = iVar112;
                          auVar304._0_4_ = iVar112;
                          auVar304._8_4_ = iVar112;
                          auVar304._12_4_ = iVar112;
                          auVar311._4_4_ = in_ZmmResult._0_4_;
                          auVar311._0_4_ = in_ZmmResult._0_4_;
                          auVar311._8_4_ = in_ZmmResult._0_4_;
                          auVar311._12_4_ = in_ZmmResult._0_4_;
                          local_348 = ZEXT816(0);
                          local_338 = 0.0;
                          auVar128 = vshufps_avx(auVar145._0_16_,auVar304,0x40);
                          local_370._0_8_ = auVar128._0_8_;
                          local_370._8_4_ = auVar128._8_4_;
                          local_370._12_4_ = auVar128._12_4_;
                          uVar198 = vmovlps_avx(auVar311);
                          local_370._16_4_ = (undefined4)uVar198;
                          local_370._20_4_ = (undefined4)((ulong)uVar198 >> 0x20);
                          local_370._24_4_ = FStack_4e8;
                          uVar198 = vmovlps_avx(auVar126);
                          fStack_354 = (float)uVar198;
                          fStack_350 = (float)((ulong)uVar198 >> 0x20);
                          local_330 = (MediumInterface *)0x0;
                          local_320.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                               (TaggedPointer<pbrt::HGPhaseFunction>)
                               (TaggedPointer<pbrt::HGPhaseFunction>)local_278;
                          auVar177._16_16_ = auVar156;
                          auVar177._0_16_ = auVar171;
                          auVar295._16_16_ = auVar255;
                          auVar295._0_16_ = auVar171;
                          auVar177 = vperm2f128_avx(auVar295,auVar177,0x31);
                          auVar268._16_16_ = auVar264;
                          auVar268._0_16_ = auVar284;
                          local_318 = vunpcklpd_avx(auVar268,auVar177);
                          local_2f8._16_16_ = vmovlhps_avx(auVar129,auVar130);
                          local_2f8._0_16_ = _local_598;
                          local_2d8.values.values[1] =
                               (float)((uint)bVar7 * auVar132._4_4_ |
                                      (uint)!bVar7 *
                                      (uint)((byte)(uVar113 >> 1) & 1) * auVar131._4_4_) *
                               (float)local_578._4_4_;
                          local_2d8.values.values[0] =
                               (float)((uint)bVar10 * auVar132._0_4_ |
                                      (uint)!bVar10 * (uint)((byte)uVar113 & 1) * auVar131._0_4_) *
                               (float)local_578._0_4_;
                          local_2d8.values.values[2] =
                               (float)((uint)bVar8 * auVar132._8_4_ |
                                      (uint)!bVar8 *
                                      (uint)((byte)(uVar113 >> 2) & 1) * auVar131._8_4_) *
                               fStack_570;
                          local_2d8.values.values[3] =
                               (float)((uint)bVar9 * auVar132._12_4_ |
                                      (uint)!bVar9 * (uint)(byte)(uVar113 >> 3) * auVar131._12_4_) *
                               fStack_56c;
                          auVar178 = ZEXT1664(auVar311);
                          auVar183 = ZEXT1664(auVar129);
                          fStack_34c = auVar171._0_4_;
                          local_328.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                   )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                     )((ulong)puVar121 | 0x4000000000000);
                          bVar123 = SampleLd::anon_class_32_4_3820c045::operator()
                                              (&local_3b8,(MediumSample *)local_370);
                          cVar124 = !bVar123;
                          if ((bool)cVar124) {
                            local_e8._8_4_ = 0x3f800000;
                            local_e8._0_8_ = 0x3f8000003f800000;
                            local_e8._12_4_ = 0x3f800000;
                          }
                          else {
                            local_5f8._0_4_ = local_478._0_4_;
                          }
                          fStack_570 = 1.0;
                          local_578 = (undefined1  [8])0x3f8000003f800000;
                          fStack_56c = 1.0;
                          auVar296 = ZEXT464((uint)local_528._0_4_);
                          lambda = local_3c0;
                        }
                      }
                    } while (cVar124 == '\0');
                    if (cVar124 == '\n') {
                      auVar130 = ZEXT416((uint)local_5f8._0_4_);
                      auVar307 = ZEXT1664(local_2c8);
                      auVar129 = ZEXT416((uint)local_538._0_4_);
                      goto LAB_004021b4;
                    }
                    auVar130 = ZEXT416((uint)local_5f8._0_4_);
                    auVar289 = ZEXT464((uint)local_558._0_4_);
                    auVar307 = ZEXT1664(local_2c8);
                  }
                  else {
                    fVar148 = auVar129._0_4_ - auVar288._0_4_;
                    auVar168._0_4_ = fVar148 * in_ZmmResult._0_4_;
                    auVar168._4_4_ = fVar148 * in_ZmmResult._4_4_;
                    auVar168._8_4_ = fVar148 * in_ZmmResult._8_4_;
                    auVar168._12_4_ = fVar148 * in_ZmmResult._12_4_;
                    auVar74._8_4_ = 0x3fb8aa3b;
                    auVar74._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar74._12_4_ = 0x3fb8aa3b;
                    auVar128 = vmulps_avx512vl(auVar168,auVar74);
                    auVar126 = vroundps_avx(auVar128,9);
                    auVar128 = vsubps_avx(auVar128,auVar126);
                    auVar221._0_4_ = (int)auVar126._0_4_;
                    auVar221._4_4_ = (int)auVar126._4_4_;
                    auVar221._8_4_ = (int)auVar126._8_4_;
                    auVar221._12_4_ = (int)auVar126._12_4_;
                    auVar262._8_4_ = 0x3da00ac9;
                    auVar262._0_8_ = 0x3da00ac93da00ac9;
                    auVar262._12_4_ = 0x3da00ac9;
                    auVar75._8_4_ = 0x3e679a0b;
                    auVar75._0_8_ = 0x3e679a0b3e679a0b;
                    auVar75._12_4_ = 0x3e679a0b;
                    auVar126 = vfmadd213ps_avx512vl(auVar262,auVar128,auVar75);
                    auVar76._8_4_ = 0x3f321004;
                    auVar76._0_8_ = 0x3f3210043f321004;
                    auVar76._12_4_ = 0x3f321004;
                    auVar126 = vfmadd213ps_avx512vl(auVar126,auVar128,auVar76);
                    auVar77._8_4_ = 0x3f800000;
                    auVar77._0_8_ = 0x3f8000003f800000;
                    auVar77._12_4_ = 0x3f800000;
                    auVar128 = vfmadd213ps_avx512vl(auVar126,auVar128,auVar77);
                    auVar156 = vpsrld_avx(auVar128,0x17);
                    auVar281._8_4_ = 0xffffff81;
                    auVar281._0_8_ = 0xffffff81ffffff81;
                    auVar281._12_4_ = 0xffffff81;
                    auVar126 = vpaddd_avx(auVar221,auVar281);
                    auVar126 = vpaddd_avx(auVar126,auVar156);
                    uVar113 = vpcmpgtd_avx512vl(auVar126,auVar281);
                    uVar113 = uVar113 & 0xf;
                    auVar78._8_4_ = 0x7f;
                    auVar78._0_8_ = 0x7f0000007f;
                    auVar78._12_4_ = 0x7f;
                    uVar116 = vpcmpgtd_avx512vl(auVar126,auVar78);
                    uVar116 = uVar116 & 0xf;
                    auVar79._8_4_ = 0x807fffff;
                    auVar79._0_8_ = 0x807fffff807fffff;
                    auVar79._12_4_ = 0x807fffff;
                    auVar128 = vpandd_avx512vl(auVar128,auVar79);
                    auVar126 = vpslld_avx(auVar126,0x17);
                    auVar80._8_4_ = 0x3f800000;
                    auVar80._0_8_ = 0x3f8000003f800000;
                    auVar80._12_4_ = 0x3f800000;
                    auVar126 = vpaddd_avx512vl(auVar126,auVar80);
                    auVar126 = vpord_avx512vl(auVar126,auVar128);
                    auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar123 = (bool)((byte)uVar116 & 1);
                    in_ZmmResult._0_4_ =
                         (float)((uint)bVar123 * auVar128._0_4_ |
                                (uint)!bVar123 * (uint)((byte)uVar113 & 1) * auVar126._0_4_);
                    bVar123 = (bool)((byte)(uVar116 >> 1) & 1);
                    in_ZmmResult._4_4_ =
                         (float)((uint)bVar123 * auVar128._4_4_ |
                                (uint)!bVar123 * (uint)((byte)(uVar113 >> 1) & 1) * auVar126._4_4_);
                    bVar123 = (bool)((byte)(uVar116 >> 2) & 1);
                    in_ZmmResult._8_4_ =
                         (float)((uint)bVar123 * auVar128._8_4_ |
                                (uint)!bVar123 * (uint)((byte)(uVar113 >> 2) & 1) * auVar126._8_4_);
                    bVar123 = SUB81(uVar116 >> 3,0);
                    in_ZmmResult._12_4_ =
                         (float)((uint)bVar123 * auVar128._12_4_ |
                                (uint)!bVar123 * (uint)(byte)(uVar113 >> 3) * auVar126._12_4_);
                    local_578._4_4_ = in_ZmmResult._4_4_ * (float)local_578._4_4_;
                    local_578._0_4_ = in_ZmmResult._0_4_ * (float)local_578._0_4_;
                    fStack_570 = in_ZmmResult._8_4_ * fStack_570;
                    auStack_568 = auVar177._16_16_;
                    fStack_56c = in_ZmmResult._12_4_ * fStack_56c;
LAB_004021b4:
                    auVar289 = ZEXT464((uint)local_558._0_4_);
                    cVar124 = '\b';
                    if ((local_5e4[iVar105] <= (float)local_558._0_4_) &&
                       (iVar112 = local_584[iVar105],
                       local_584[iVar105] = iVar112 + aiStack_4b0[iVar105],
                       iVar112 + aiStack_4b0[iVar105] != aiStack_394[iVar105])) {
                      local_5e4[iVar105] = local_5e4[iVar105] + afStack_4a4[iVar105];
                      cVar124 = '\0';
                      auVar130 = auVar129;
                    }
                  }
                  auVar288 = ZEXT1664(auVar130);
                } while (cVar124 == '\0');
                auVar135 = local_e8;
                if (cVar124 == '\b') {
                  auVar135 = _local_578;
                }
              }
              auVar129 = vshufpd_avx(auVar135,auVar135,1);
              local_e8 = auVar135;
            }
LAB_00402265:
            IVar100 = IStack_250;
          }
          auVar129 = vunpcklpd_avx(auVar135,auVar129);
          fVar148 = auVar129._0_4_;
          fVar194 = auVar129._4_4_;
          fVar195 = auVar129._8_4_;
          fVar308 = auVar129._12_4_;
          local_468.values.values[0] = fVar148 * local_468.values.values[0];
          local_468.values.values[1] = fVar194 * local_468.values.values[1];
          local_468.values.values[2] = fVar195 * local_468.values.values[2];
          local_468.values.values[3] = fVar308 * local_468.values.values[3];
          local_4c8.values.values[0] = fVar148 * local_4c8.values.values[0];
          local_4c8.values.values[1] = fVar194 * local_4c8.values.values[1];
          local_4c8.values.values[2] = fVar195 * local_4c8.values.values[2];
          local_4c8.values.values[3] = fVar308 * local_4c8.values.values[3];
          local_428.values.values[0] = fVar148 * local_428.values.values[0];
          local_428.values.values[1] = fVar194 * local_428.values.values[1];
          local_428.values.values[2] = fVar195 * local_428.values.values[2];
          local_428.values.values[3] = fVar308 * local_428.values.values[3];
        }
        if ((local_468.values.values[0] == 0.0) && (!NAN(local_468.values.values[0]))) {
          uVar113 = 0;
          while (uVar116 = uVar113, uVar116 != 3) {
            fVar148 = local_468.values.values[uVar116 + 1];
            if ((fVar148 != 0.0) || (uVar113 = uVar116 + 1, NAN(fVar148))) break;
          }
          iVar105 = 1;
          if (2 < uVar116) goto LAB_004026d7;
        }
        iVar105 = 3;
        if (local_118._0_1_ == true) {
          IStack_250 = IVar100;
          if (local_58 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
          }
          auVar178 = ZEXT1664(auVar178._0_16_);
          auVar183 = ZEXT1664(auVar183._0_16_);
          Interaction::SpawnRayTo((Ray *)local_370,(Interaction *)local_218,&local_a8);
          fStack_248 = (float)local_370._16_4_;
          uStack_244 = CONCAT44(local_370._24_4_,local_370._20_4_);
          local_258.low = (Float)local_370._0_4_;
          local_258.high = (Float)local_370._4_4_;
          IStack_250.low = (Float)local_370._8_4_;
          IStack_250.high = (Float)local_370._12_4_;
          local_238.bits._4_4_ = fStack_34c;
          local_238.bits._0_4_ = fStack_350;
          iVar105 = 0;
          IVar100 = (Interval)local_370._8_8_;
        }
      }
LAB_004026d7:
      if (local_118._0_1_ == true) {
        local_118 = local_118 & 0xffffffffffffff00;
      }
    } while (iVar105 == 0);
    if (iVar105 == 3) {
LAB_004026fa:
      auVar178 = _local_218;
      local_4c8.values.values[0] =
           (float)local_48._0_4_ * (pathPDF->values).values[0] * local_4c8.values.values[0];
      local_4c8.values.values[1] =
           (float)local_48._0_4_ * (pathPDF->values).values[1] * local_4c8.values.values[1];
      local_4c8.values.values[2] =
           (float)local_48._0_4_ * (pathPDF->values).values[2] * local_4c8.values.values[2];
      local_4c8.values.values[3] =
           (float)local_48._0_4_ * (pathPDF->values).values[3] * local_4c8.values.values[3];
      local_428.values.values[0] =
           local_108 * (pathPDF->values).values[0] * local_428.values.values[0];
      local_428.values.values[1] =
           local_108 * (pathPDF->values).values[1] * local_428.values.values[1];
      local_428.values.values[2] =
           local_108 * (pathPDF->values).values[2] * local_428.values.values[2];
      local_428.values.values[3] =
           local_108 * (pathPDF->values).values[3] * local_428.values.values[3];
      IStack_250 = IVar100;
      if (*(uint *)((ulong)local_228 & 0xffffffffffff) < 2) {
        if (local_58 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
        }
        auVar174._0_4_ =
             (float)local_408 * (local_220->values).values[0] * local_468.values.values[0] *
             local_c8;
        auVar174._4_4_ =
             local_408._4_4_ * (local_220->values).values[1] * local_468.values.values[1] *
             afStack_c4[0];
        auVar174._8_4_ =
             (float)uStack_400 * (local_220->values).values[2] * local_468.values.values[2] *
             afStack_c4[1];
        auVar174._12_4_ =
             uStack_400._4_4_ * (local_220->values).values[3] * local_468.values.values[3] *
             afStack_c4[2];
        lVar111 = 1;
        do {
          local_4c8.values.values[0] = local_4c8.values.values[0] + local_4c8.values.values[lVar111]
          ;
          lVar111 = lVar111 + 1;
        } while (lVar111 != 4);
      }
      else {
        if (local_58 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
        }
        auVar174._0_4_ =
             (float)local_408 * (local_220->values).values[0] * local_468.values.values[0] *
             local_c8;
        auVar174._4_4_ =
             local_408._4_4_ * (local_220->values).values[1] * local_468.values.values[1] *
             afStack_c4[0];
        auVar174._8_4_ =
             (float)uStack_400 * (local_220->values).values[2] * local_468.values.values[2] *
             afStack_c4[1];
        auVar174._12_4_ =
             uStack_400._4_4_ * (local_220->values).values[3] * local_468.values.values[3] *
             afStack_c4[2];
        local_4c8.values.values[0] = local_428.values.values[0] + local_4c8.values.values[0];
        afStack_214[0] = local_428.values.values[1] + local_4c8.values.values[1];
        local_218 = (undefined1  [4])local_4c8.values.values[0];
        afStack_214[1] = local_428.values.values[2] + local_4c8.values.values[2];
        _IStack_208 = auVar178._16_48_;
        afStack_214[2] = local_428.values.values[3] + local_4c8.values.values[3];
        lVar111 = 1;
        do {
          local_4c8.values.values[0] =
               local_4c8.values.values[0] + *(float *)(local_218 + lVar111 * 4);
          lVar111 = lVar111 + 1;
        } while (lVar111 != 4);
      }
      local_4c8.values.values[0] = local_4c8.values.values[0] * 0.25;
      auVar230._4_4_ = local_4c8.values.values[0];
      auVar230._0_4_ = local_4c8.values.values[0];
      auVar230._8_4_ = local_4c8.values.values[0];
      auVar230._12_4_ = local_4c8.values.values[0];
      auVar129 = vdivps_avx(auVar174,auVar230);
      uVar251 = auVar129._0_8_;
      auVar129 = vshufpd_avx(auVar129,auVar129,1);
      uVar198 = auVar129._0_8_;
      goto LAB_0040284b;
    }
  }
LAB_00402835:
  uVar198 = 0;
  uVar251 = 0;
LAB_0040284b:
  SVar323.values.values[2] = (float)(int)uVar198;
  SVar323.values.values[3] = (float)(int)((ulong)uVar198 >> 0x20);
  SVar323.values.values[0] = (float)(int)uVar251;
  SVar323.values.values[1] = (float)(int)((ulong)uVar251 >> 0x20);
  return (SampledSpectrum)SVar323.values.values;
}

Assistant:

SampledSpectrum VolPathIntegrator::SampleLd(const Interaction &intr, const BSDF *bsdf,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            const SampledSpectrum &T_hat,
                                            const SampledSpectrum &pathPDF) const {
    // Estimate light-sampled direct illumination at _intr_
    // Initialize _LightSampleContext_ for volumetric light sampling
    LightSampleContext ctx;
    if (bsdf) {
        ctx = LightSampleContext(intr.AsSurface());
        // Try to nudge the light sampling position to correct side of the surface
        if (bsdf->HasReflection() && !bsdf->HasTransmission())
            ctx.pi = intr.OffsetRayOrigin(intr.wo);
        else if (bsdf->HasTransmission() && !bsdf->HasReflection())
            ctx.pi = intr.OffsetRayOrigin(-intr.wo);

    } else
        ctx = LightSampleContext(intr);

    // Sample a light source using _lightSampler_
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(ctx, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return SampledSpectrum(0.f);
    LightHandle light = sampledLight->light;
    CHECK(light != nullptr && sampledLight->pdf != 0);

    // Sample a point on the light source
    pstd::optional<LightLiSample> ls =
        light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls->L || ls->pdf == 0)
        return SampledSpectrum(0.f);
    Float lightPDF = sampledLight->pdf * ls->pdf;

    // Evaluate BSDF or phase function for light sample direction
    Float scatterPDF;
    SampledSpectrum f_hat;
    Vector3f wo = intr.wo, wi = ls->wi;
    if (bsdf) {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the BSDF
        f_hat = bsdf->f(wo, wi) * AbsDot(wi, intr.AsSurface().shading.n);
        scatterPDF = bsdf->PDF(wo, wi);

    } else {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the phase function
        CHECK(intr.IsMediumInteraction());
        PhaseFunctionHandle phase = intr.AsMedium().phase;
        f_hat = SampledSpectrum(phase.p(wo, wi));
        scatterPDF = phase.PDF(wo, wi);
    }
    if (!f_hat)
        return SampledSpectrum(0.f);

    // Declare path state variables for ray to light source
    Ray lightRay = intr.SpawnRayTo(ls->pLight);
    SampledSpectrum T_ray(1.f), lightPathPDF(1.f), uniPathPDF(1.f);
    RNG rng(Hash(lightRay.o), Hash(lightRay.d));

    while (lightRay.d != Vector3f(0, 0, 0)) {
        // Trace ray through media to estimate transmittance
        pstd::optional<ShapeIntersection> si = Intersect(lightRay, 1 - ShadowEpsilon);
        // Handle opaque surface along ray's path
        if (si && si->intr.material)
            return SampledSpectrum(0.f);

        // Update transmittance for current ray segment
        if (lightRay.medium != nullptr) {
            Float tMax = si ? si->tHit : (1 - ShadowEpsilon);
            SampledSpectrum Tmaj = lightRay.medium.SampleTmaj(
                lightRay, tMax, rng.Uniform<Float>(), rng, lambda,
                [&](const MediumSample &mediumSample) {
                    // Update ray transmittance estimate at sampled point
                    // Update _T_ray_ and PDFs using ratio-tracking estimator
                    const MediumInteraction &intr = mediumSample.intr;
                    SampledSpectrum Tmaj = mediumSample.Tmaj, sigma_n = intr.sigma_n();
                    T_ray *= Tmaj * sigma_n;
                    lightPathPDF *= Tmaj * intr.sigma_maj;
                    uniPathPDF *= Tmaj * sigma_n;

                    // Possibly terminate transmittance computation using Russian roulette
                    SampledSpectrum Tr = T_ray / (lightPathPDF + uniPathPDF).Average();
                    if (Tr.MaxComponentValue() < 0.05f) {
                        Float q = 0.75f;
                        if (rng.Uniform<Float>() < q)
                            T_ray = SampledSpectrum(0.);
                        else {
                            lightPathPDF *= 1 - q;
                            uniPathPDF *= 1 - q;
                        }
                    }

                    if (!T_ray)
                        return false;
                    Rescale(T_ray, lightPathPDF, uniPathPDF);
                    return true;
                });
            // Update transmittance estimate for final unsampled segment
            T_ray *= Tmaj;
            lightPathPDF *= Tmaj;
            uniPathPDF *= Tmaj;
        }

        // Generate next ray segment or return final transmittance
        if (!T_ray)
            return SampledSpectrum(0.f);
        if (!si)
            break;
        lightRay = si->intr.SpawnRayTo(ls->pLight);
    }
    // Return path contribution function estimate for direct lighting
    lightPathPDF *= pathPDF * lightPDF;
    uniPathPDF *= pathPDF * scatterPDF;
    if (IsDeltaLight(light.Type()))
        return T_hat * f_hat * T_ray * ls->L / lightPathPDF.Average();
    else
        return T_hat * f_hat * T_ray * ls->L / (lightPathPDF + uniPathPDF).Average();
}